

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O3

int __thiscall amrex::EB2::Level::coarsenFromFine(Level *this,Level *fineLevel,bool fill_boundary)

{
  DistributionMapping *dm;
  MultiFab *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  undefined8 *puVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  element_type *peVar13;
  int iVar14;
  uint uVar15;
  byte bVar16;
  byte bVar17;
  EBCellFlag *pEVar18;
  Long LVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  int i;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  byte bVar59;
  long lVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  uint uVar65;
  uint uVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  long lVar71;
  bool bVar72;
  char cVar73;
  char cVar74;
  BoxArray *this_01;
  double *pdVar75;
  byte bVar76;
  bool bVar77;
  char cVar78;
  bool bVar79;
  char cVar80;
  int iVar81;
  bool bVar82;
  int iVar83;
  int iVar84;
  long lVar85;
  bool bVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  long lVar91;
  bool bVar92;
  byte bVar93;
  long lVar94;
  long lVar95;
  char cVar96;
  int iVar97;
  uint32_t *puVar98;
  long *plVar99;
  bool bVar100;
  int iVar101;
  int iVar102;
  long lVar103;
  ulong uVar104;
  byte bVar105;
  int iVar106;
  FabArray<amrex::FArrayBox> *this_02;
  bool bVar107;
  char cVar108;
  int iVar109;
  int iVar110;
  uint32_t *puVar111;
  double dVar112;
  undefined1 auVar113 [16];
  _func_int *p_Var114;
  undefined *puVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  byte bVar120;
  byte bVar121;
  Periodicity PVar122;
  IntVect edge_type;
  MFIter mfi;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  long local_1350;
  undefined1 local_1218 [24];
  pointer local_1200;
  undefined8 uStack_11f8;
  int local_11f0;
  BoxArray *local_11d8;
  int local_11c8;
  int local_11c4;
  FabArray<amrex::FArrayBox> *local_11c0;
  EBCellFlag *local_11b8;
  ulong local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  ulong local_1198;
  ulong local_1190;
  long local_1188;
  long local_1180;
  long local_1178;
  double *local_1158;
  long local_1150;
  undefined **local_1148;
  EBCellFlag *local_1140;
  _func_int **local_1138;
  long local_1130;
  Array4<amrex::EBCellFlag> local_1128;
  undefined1 local_10e8 [104];
  FabArray<amrex::FArrayBox> *local_1080;
  FabArray<amrex::EBCellFlagFab> *local_1078;
  ulong local_1070;
  ulong local_1068;
  EBCellFlag *local_1060;
  EBCellFlag *local_1058;
  ulong local_1050;
  ulong local_1048;
  double *local_1040;
  double *local_1038;
  double *local_1030;
  ulong local_1028;
  long local_1020;
  double *local_1018;
  double *local_1010;
  uint local_1008;
  int local_fd4;
  int local_fa0;
  int local_f9c;
  int local_f98;
  int local_f94;
  int local_f90;
  int local_f8c;
  int local_f88;
  int local_f84;
  int local_f80;
  int local_f7c;
  int local_f78;
  int local_f74;
  int local_f70;
  int local_f6c;
  int local_f68;
  int local_f64;
  int local_f60;
  int local_f5c;
  int local_f58;
  int local_f54;
  int local_f50;
  int local_f4c;
  int local_f48;
  int local_f44;
  int local_f40;
  int local_f3c;
  undefined1 local_f38 [32];
  int local_f18;
  int local_f14;
  int local_f10;
  Array4<double> local_ef8;
  FabArray<amrex::FArrayBox> *local_eb8;
  FabArray<amrex::FArrayBox> *local_eb0;
  FabArray<amrex::FArrayBox> *local_ea8;
  FabArray<amrex::FArrayBox> *local_ea0;
  FabArray<amrex::FArrayBox> *local_e98;
  long local_e90;
  double *local_e88;
  long local_e80;
  long local_e60;
  long local_e58;
  double *local_e50;
  double *local_e48;
  double *local_e40;
  ulong local_e38;
  ulong local_e30;
  ulong local_e28;
  ulong local_e20;
  ulong local_e18;
  double *local_e10;
  double *local_e08;
  double *local_e00;
  double *local_df8;
  double *local_df0;
  Array4<double> local_de8;
  Box local_da4;
  Array4<double> local_d88;
  FabArray<amrex::FArrayBox> *local_d40;
  FabArray<amrex::FArrayBox> *local_d38;
  FabArray<amrex::FArrayBox> *local_d30;
  FabArray<amrex::FArrayBox> *local_d28;
  FabArray<amrex::FArrayBox> *local_d20;
  FabArray<amrex::FArrayBox> *local_d18;
  FabArray<amrex::FArrayBox> *local_d10;
  FabArray<amrex::FArrayBox> *local_d08;
  FabArray<amrex::FArrayBox> *local_d00;
  FabArray<amrex::FArrayBox> *local_cf8;
  FabArray<amrex::FArrayBox> *local_cf0;
  FabArray<amrex::FArrayBox> *local_ce8;
  FabArray<amrex::FArrayBox> *local_ce0;
  FabArray<amrex::FArrayBox> *local_cd8;
  FabArray<amrex::FArrayBox> *local_cd0;
  FabArray<amrex::FArrayBox> *local_cc8;
  FabArray<amrex::FArrayBox> *local_cc0;
  FabArray<amrex::FArrayBox> *local_cb8;
  FabArray<amrex::FArrayBox> *local_cb0;
  FabArray<amrex::FArrayBox> *local_ca8;
  FabArray<amrex::FArrayBox> *local_ca0;
  FabArray<amrex::EBCellFlagFab> *local_c98;
  long local_c80;
  long local_c68;
  long local_c50;
  long local_be8;
  long local_bd0;
  long local_bb8;
  long local_ba0;
  long local_b88;
  long local_b70;
  double *local_b60;
  long local_b58;
  long local_b50;
  double *local_b48;
  long local_b40;
  long local_b28;
  long local_b20;
  double *local_b18;
  long local_b10;
  long local_af8;
  long local_ae0;
  long local_ac8;
  undefined **local_ab8;
  long local_ab0;
  EBCellFlag *local_aa0;
  long local_a98;
  pointer local_a90;
  _func_int **local_a88;
  double *local_a80;
  double *local_a78;
  long local_a60;
  long local_a40;
  long local_a28;
  long local_980;
  long local_970;
  long local_960;
  long local_950;
  long local_940;
  long local_930;
  long local_928;
  long local_920;
  double *local_918;
  long local_910;
  long local_900;
  long local_8f8;
  long local_8f0;
  long local_8e0;
  long local_8d0;
  long local_8c0;
  long local_8b0;
  long local_8a8;
  long local_8a0;
  Arena *local_898;
  double *local_890;
  double *local_888;
  double *local_880;
  double *local_878;
  double *local_870;
  double *local_868;
  double *local_860;
  double *local_858;
  double *local_850;
  double *local_848;
  long local_840;
  double *local_838;
  double *local_830;
  long local_828;
  undefined **local_820;
  EBCellFlag *local_818;
  _func_int **local_810;
  EBCellFlag *local_808;
  ulong local_800;
  long local_7f0;
  long local_7e8;
  long local_7d8;
  long local_7d0;
  double *local_7c0;
  double *local_7b8;
  double *local_7b0;
  double *local_7a8;
  double *local_7a0;
  long local_798;
  long local_790;
  long local_788;
  long local_768;
  long local_760;
  long local_758;
  long local_750;
  long local_748;
  long local_740;
  long local_738;
  long local_730;
  long local_728;
  long local_720;
  long local_718;
  double *local_710;
  double *local_708;
  double *local_700;
  double *local_6f8;
  double *local_6f0;
  double *local_6e8;
  double *local_6e0;
  double *local_6d8;
  double *local_6d0;
  double *local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  double *local_6a8;
  double *local_6a0;
  double *local_698;
  double *local_690;
  double *local_688;
  double *local_680;
  double *local_678;
  double *local_670;
  double *local_668;
  ulong local_660;
  double *local_658;
  Box local_64c;
  Array4<double> local_630;
  Array4<double> local_5f0;
  Array4<double> local_5b0;
  undefined1 local_570 [32];
  int local_550;
  int local_54c;
  int local_548;
  Array4<const_double> local_530;
  Array4<const_double> local_4f0;
  Array4<const_double> local_4b0;
  Array4<const_double> local_470;
  Array4<const_double> local_430;
  Array4<const_double> local_3f0;
  Array4<double> local_3b0;
  Array4<const_amrex::EBCellFlag> local_370;
  Array4<const_double> local_330;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Array4<const_double> local_230;
  Array4<const_double> local_1f0;
  Array4<const_double> local_1b0;
  Array4<const_double> local_170;
  Array4<amrex::EBCellFlag> local_130;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  amrex::coarsen((BoxArray *)local_10e8,&fineLevel->m_grids,2);
  this_01 = &this->m_grids;
  BoxArray::operator=(this_01,(BoxArray *)local_10e8);
  BoxArray::~BoxArray((BoxArray *)local_10e8);
  local_11d8 = &fineLevel->m_covered_grids;
  amrex::coarsen((BoxArray *)local_10e8,&fineLevel->m_covered_grids,2);
  BoxArray::operator=(&this->m_covered_grids,(BoxArray *)local_10e8);
  BoxArray::~BoxArray((BoxArray *)local_10e8);
  (this->m_dmap).m_ref.
  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fineLevel->m_dmap).m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_dmap).m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(fineLevel->m_dmap).m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar20 = BoxArray::coarsenable(&fineLevel->m_grids,2,2);
  iVar83 = 1;
  if ((bVar20) &&
     ((peVar13 = (fineLevel->m_covered_grids).m_ref.
                 super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      (peVar13->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (peVar13->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish || (bVar20 = BoxArray::coarsenable(local_11d8,2,2), bVar20)))) {
    dm = &this->m_dmap;
    this_00 = &this->m_levelset;
    local_1128.p = (EBCellFlag *)0x100000001;
    local_1128.jstride._0_4_ = 1;
    convert((BoxArray *)local_10e8,this_01,(IntVect *)&local_1128);
    local_1218._0_8_ = (_func_int **)0x1;
    local_1218._8_8_ = (Arena *)0x0;
    local_1218._16_8_ = (pointer)0x0;
    local_1200 = (pointer)0x0;
    uStack_11f8 = (pointer)0x0;
    local_ef8.p = (double *)&PTR__FabFactory_0080b918;
    MultiFab::define(this_00,(BoxArray *)local_10e8,dm,1,0,(MFInfo *)local_1218,
                     (FabFactory<amrex::FArrayBox> *)&local_ef8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1218 + 0x10));
    BoxArray::~BoxArray((BoxArray *)local_10e8);
    MFIter::MFIter((MFIter *)local_10e8,(FabArrayBase *)this_00,true);
    bVar16 = 0;
    if ((int)local_10e8._32_4_ < (int)local_10e8._40_4_) {
      do {
        local_1218._0_8_ = (_func_int **)0x0;
        local_1218._8_8_ = local_1218._8_8_ & 0xffffffff00000000;
        MFIter::tilebox((Box *)&local_ef8,(MFIter *)local_10e8,(IntVect *)local_1218);
        MFIter::tilebox((Box *)&local_de8,(MFIter *)local_10e8);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_1218,&this_00->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_10e8);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_1128,
                   &(fineLevel->m_levelset).super_FabArray<amrex::FArrayBox>,(MFIter *)local_10e8);
        iVar109 = local_ef8.kstride._4_4_;
        iVar89 = (int)local_ef8.kstride;
        iVar87 = local_ef8.jstride._4_4_;
        iVar83 = local_1128.begin.y;
        LVar19 = local_1128.kstride;
        pEVar18 = local_1128.p;
        lVar53 = CONCAT44(local_1128.jstride._4_4_,(undefined4)local_1128.jstride);
        local_1130 = (long)local_1128.begin.z;
        if ((int)local_de8.jstride <= local_de8.kstride._4_4_) {
          lVar51 = (long)local_de8.p._4_4_;
          iVar81 = (int)local_de8.jstride * 2;
          iVar101 = (int)local_de8.jstride;
          do {
            if (local_de8.p._4_4_ <= (int)local_de8.kstride) {
              lVar103 = local_1218._0_8_ +
                        ((long)iVar101 - (long)local_11f0) * local_1218._16_8_ * 8 +
                        (lVar51 - uStack_11f8._4_4_) * local_1218._8_8_ * 8 +
                        (long)(int)local_de8.p * 8 + (long)(int)uStack_11f8 * -8;
              puVar98 = (uint32_t *)
                        ((long)&local_1128.p
                                [(long)local_1128.begin.x * -2 +
                                 (lVar51 * 2 - (long)local_1128.begin.y) * lVar53 * 2 +
                                 (long)(int)local_de8.p * 4].flag +
                        (iVar81 - local_1130) * local_1128.kstride * 8);
              lVar94 = lVar51;
              do {
                if ((int)local_de8.p <= local_de8.jstride._4_4_) {
                  lVar60 = 0;
                  puVar111 = puVar98;
                  do {
                    *(undefined8 *)(lVar103 + lVar60 * 8) = *(undefined8 *)puVar111;
                    lVar60 = lVar60 + 1;
                    puVar111 = puVar111 + 4;
                  } while ((local_de8.jstride._4_4_ - (int)local_de8.p) + 1 != (int)lVar60);
                }
                lVar94 = lVar94 + 1;
                lVar103 = lVar103 + local_1218._8_8_ * 8;
                puVar98 = puVar98 + lVar53 * 4;
              } while ((int)local_de8.kstride + 1 != (int)lVar94);
            }
            iVar81 = iVar81 + 2;
            bVar20 = iVar101 != local_de8.kstride._4_4_;
            iVar101 = iVar101 + 1;
          } while (bVar20);
        }
        bVar76 = 0;
        if ((int)local_ef8.jstride <= local_ef8.kstride._4_4_) {
          iVar101 = (int)local_ef8.p;
          iVar24 = local_ef8.p._4_4_;
          iVar38 = local_ef8.jstride._4_4_ - (int)local_ef8.p;
          iVar25 = (int)local_ef8.p * 2 - local_1128.begin.x;
          bVar76 = 0;
          iVar81 = (int)local_ef8.jstride;
          do {
            if (iVar24 <= iVar89) {
              iVar39 = iVar81 * 2 - (int)local_1130;
              lVar94 = LVar19 * iVar39;
              lVar103 = (iVar39 + 2) * LVar19;
              lVar51 = (iVar39 + 1) * LVar19;
              iVar39 = iVar24;
              do {
                if (iVar101 <= iVar87) {
                  iVar67 = iVar39 * 2 - iVar83;
                  lVar71 = lVar53 * iVar67;
                  lVar85 = (iVar67 + 2) * lVar53;
                  lVar60 = (iVar67 + 1) * lVar53;
                  iVar68 = iVar38 + 1;
                  iVar67 = iVar25;
                  bVar17 = bVar76;
                  do {
                    lVar95 = (long)iVar67;
                    dVar116 = *(double *)(pEVar18 + lVar71 * 2 + lVar95 * 2 + lVar94 * 2);
                    lVar52 = (long)(iVar67 + 1);
                    dVar117 = *(double *)(pEVar18 + lVar71 * 2 + lVar52 * 2 + lVar94 * 2);
                    if (((dVar116 < 0.0) || (bVar20 = true, 0.0 <= dVar117)) &&
                       (bVar20 = false, 0.0 <= dVar117)) {
                      bVar20 = dVar116 < 0.0;
                    }
                    iVar67 = iVar67 + 2;
                    lVar91 = (long)iVar67;
                    dVar118 = *(double *)(pEVar18 + lVar71 * 2 + lVar91 * 2 + lVar94 * 2);
                    if (((dVar117 < 0.0) || (bVar61 = true, 0.0 <= dVar118)) &&
                       (bVar61 = false, 0.0 <= dVar118)) {
                      bVar61 = dVar117 < 0.0;
                    }
                    dVar117 = *(double *)(pEVar18 + lVar85 * 2 + lVar95 * 2 + lVar94 * 2);
                    dVar8 = *(double *)(pEVar18 + lVar85 * 2 + lVar52 * 2 + lVar94 * 2);
                    if (((dVar117 < 0.0) || (bVar21 = true, 0.0 <= dVar8)) &&
                       (bVar21 = false, 0.0 <= dVar8)) {
                      bVar21 = dVar117 < 0.0;
                    }
                    dVar9 = *(double *)(pEVar18 + lVar85 * 2 + lVar91 * 2 + lVar94 * 2);
                    if (((dVar8 < 0.0) || (bVar62 = true, 0.0 <= dVar9)) &&
                       (bVar62 = false, 0.0 <= dVar9)) {
                      bVar62 = dVar8 < 0.0;
                    }
                    dVar8 = *(double *)(pEVar18 + lVar71 * 2 + lVar95 * 2 + lVar103 * 2);
                    dVar10 = *(double *)(pEVar18 + lVar71 * 2 + lVar52 * 2 + lVar103 * 2);
                    if (((dVar8 < 0.0) || (bVar55 = true, 0.0 <= dVar10)) &&
                       (bVar55 = false, 0.0 <= dVar10)) {
                      bVar55 = dVar8 < 0.0;
                    }
                    dVar11 = *(double *)(pEVar18 + lVar71 * 2 + lVar91 * 2 + lVar103 * 2);
                    if (((dVar10 < 0.0) || (bVar56 = true, 0.0 <= dVar11)) &&
                       (bVar56 = false, 0.0 <= dVar11)) {
                      bVar56 = dVar10 < 0.0;
                    }
                    dVar10 = *(double *)(pEVar18 + lVar85 * 2 + lVar95 * 2 + lVar103 * 2);
                    dVar12 = *(double *)(pEVar18 + lVar85 * 2 + lVar52 * 2 + lVar103 * 2);
                    if (((dVar10 < 0.0) || (bVar79 = true, 0.0 <= dVar12)) &&
                       (bVar79 = false, 0.0 <= dVar12)) {
                      bVar79 = dVar10 < 0.0;
                    }
                    dVar112 = *(double *)(pEVar18 + lVar85 * 2 + lVar91 * 2 + lVar103 * 2);
                    if (((dVar12 < 0.0) || (bVar82 = true, 0.0 <= dVar112)) &&
                       (bVar82 = false, 0.0 <= dVar112)) {
                      bVar82 = dVar12 < 0.0;
                    }
                    dVar12 = *(double *)(pEVar18 + lVar60 * 2 + lVar95 * 2 + lVar94 * 2);
                    if (((dVar116 < 0.0) || (bVar107 = true, 0.0 <= dVar12)) &&
                       (bVar107 = false, 0.0 <= dVar12)) {
                      bVar107 = dVar116 < 0.0;
                    }
                    bVar105 = -(dVar117 < 0.0 && 0.0 <= dVar12);
                    bVar76 = dVar12 < 0.0 | bVar105;
                    if (dVar117 < 0.0) {
                      bVar76 = bVar105;
                    }
                    dVar12 = *(double *)(pEVar18 + lVar60 * 2 + lVar91 * 2 + lVar94 * 2);
                    if (((dVar118 < 0.0) || (bVar63 = true, 0.0 <= dVar12)) &&
                       (bVar63 = false, 0.0 <= dVar12)) {
                      bVar63 = dVar118 < 0.0;
                    }
                    if (((dVar12 < 0.0) || (bVar92 = true, 0.0 <= dVar9)) &&
                       (bVar92 = false, 0.0 <= dVar9)) {
                      bVar92 = dVar12 < 0.0;
                    }
                    dVar12 = *(double *)(pEVar18 + lVar60 * 2 + lVar95 * 2 + lVar103 * 2);
                    if (((dVar8 < 0.0) || (bVar57 = true, 0.0 <= dVar12)) &&
                       (bVar57 = false, 0.0 <= dVar12)) {
                      bVar57 = dVar8 < 0.0;
                    }
                    bVar59 = -(0.0 <= dVar12 && dVar10 < 0.0);
                    bVar105 = dVar12 < 0.0 | bVar59;
                    if (dVar10 < 0.0) {
                      bVar105 = bVar59;
                    }
                    dVar12 = *(double *)(pEVar18 + lVar60 * 2 + lVar91 * 2 + lVar103 * 2);
                    if (((dVar11 < 0.0) || (bVar64 = true, 0.0 <= dVar12)) &&
                       (bVar64 = false, 0.0 <= dVar12)) {
                      bVar64 = dVar11 < 0.0;
                    }
                    if (((dVar12 < 0.0) || (bVar58 = true, 0.0 <= dVar112)) &&
                       (bVar58 = false, 0.0 <= dVar112)) {
                      bVar58 = dVar12 < 0.0;
                    }
                    dVar12 = *(double *)(pEVar18 + lVar71 * 2 + lVar95 * 2 + lVar51 * 2);
                    if (((dVar116 < 0.0) || (bVar72 = true, 0.0 <= dVar12)) &&
                       (bVar72 = false, 0.0 <= dVar12)) {
                      bVar72 = dVar116 < 0.0;
                    }
                    bVar121 = -(dVar8 < 0.0 && 0.0 <= dVar12);
                    bVar59 = dVar12 < 0.0 | bVar121;
                    if (dVar8 < 0.0) {
                      bVar59 = bVar121;
                    }
                    dVar12 = *(double *)(pEVar18 + lVar71 * 2 + lVar91 * 2 + lVar51 * 2);
                    if (((dVar118 < 0.0) || (bVar86 = true, 0.0 <= dVar12)) &&
                       (bVar86 = false, 0.0 <= dVar12)) {
                      bVar86 = dVar118 < 0.0;
                    }
                    bVar93 = -(0.0 <= dVar12 && dVar11 < 0.0);
                    bVar121 = dVar12 < 0.0 | bVar93;
                    if (dVar11 < 0.0) {
                      bVar121 = bVar93;
                    }
                    dVar12 = *(double *)(pEVar18 + lVar85 * 2 + lVar95 * 2 + lVar51 * 2);
                    if (((dVar117 < 0.0) || (bVar77 = true, 0.0 <= dVar12)) &&
                       (bVar77 = false, 0.0 <= dVar12)) {
                      bVar77 = dVar117 < 0.0;
                    }
                    bVar120 = -(dVar10 < 0.0 && 0.0 <= dVar12);
                    bVar93 = dVar12 < 0.0 | bVar120;
                    if (dVar10 < 0.0) {
                      bVar93 = bVar120;
                    }
                    dVar12 = *(double *)(pEVar18 + lVar85 * 2 + lVar91 * 2 + lVar51 * 2);
                    if (((dVar9 < 0.0) || (bVar100 = true, 0.0 <= dVar12)) &&
                       (bVar100 = false, 0.0 <= dVar12)) {
                      bVar100 = dVar9 < 0.0;
                    }
                    if (((dVar12 < 0.0) || (bVar22 = true, 0.0 <= dVar112)) &&
                       (bVar22 = false, 0.0 <= dVar112)) {
                      bVar22 = dVar12 < 0.0;
                    }
                    cVar96 = bVar107 + (bVar76 & 1);
                    cVar108 = bVar57 + (bVar105 & 1);
                    cVar73 = bVar72 + (bVar59 & 1);
                    cVar78 = bVar77 + (bVar93 & 1);
                    cVar74 = cVar108 + cVar96 + cVar73 + cVar78;
                    if (cVar74 == '\0') {
                      bVar105 = 0;
                      bVar76 = 0;
                    }
                    else if (cVar74 == '\x02') {
                      bVar105 = 1;
                      bVar76 = 0;
                    }
                    else {
                      bVar76 = 1;
                      bVar105 = 0;
                    }
                    cVar74 = bVar86 + (bVar121 & 1);
                    cVar80 = bVar58 + bVar64 + bVar92 + bVar63 + cVar74 + bVar22 + bVar100;
                    if (cVar80 == '\0') {
                      bVar59 = 0;
                    }
                    else if (cVar80 == '\x02') {
                      bVar59 = 1;
                    }
                    else {
                      bVar76 = 1;
                      bVar59 = 0;
                    }
                    cVar74 = cVar73 + bVar61 + bVar20 + bVar56 + bVar55 + cVar74;
                    if (cVar74 == '\0') {
LAB_006107d5:
                      bVar121 = 0;
                    }
                    else {
                      if (cVar74 != '\x02') {
                        bVar76 = 1;
                        goto LAB_006107d5;
                      }
                      bVar121 = 1;
                    }
                    cVar74 = cVar78 + bVar62 + bVar21 + bVar82 + bVar79 + bVar22 + bVar100;
                    if (cVar74 == '\0') {
                      bVar93 = 0;
                    }
                    else if (cVar74 == '\x02') {
                      bVar93 = 1;
                    }
                    else {
                      bVar76 = 1;
                      bVar93 = 0;
                    }
                    cVar74 = bVar62 + bVar21 + bVar61 + bVar20 + cVar96 + bVar92 + bVar63;
                    if (cVar74 == '\0') {
                      bVar120 = 0;
                    }
                    else if (cVar74 == '\x02') {
                      bVar120 = 1;
                    }
                    else {
                      bVar76 = 1;
                      bVar120 = 0;
                    }
                    cVar74 = bVar82 + bVar79 + bVar56 + bVar55 + cVar108 + bVar58 + bVar64;
                    if (cVar74 != '\0') {
                      if (cVar74 == '\x02') {
                        if ((bool)(bVar93 & bVar59 & bVar120 & bVar105 & bVar121)) {
                          bVar105 = (dVar112 < 0.0) + (dVar10 < 0.0) + (dVar11 < 0.0) +
                                    (dVar8 < 0.0) + (dVar9 < 0.0) +
                                    (dVar117 < 0.0) + (dVar116 < 0.0) + (dVar118 < 0.0);
                          if ((bVar105 & 0xfb) == 2) {
                            bVar76 = 1;
                          }
                          else if (bVar105 != 4) {
                            Abort_host("amrex::check_mvmc: how did this happen? nopen != 4");
                            bVar76 = 1;
                          }
                        }
                      }
                      else {
                        bVar76 = 1;
                      }
                    }
                    if (bVar76 < bVar17) {
                      bVar76 = bVar17;
                    }
                    iVar68 = iVar68 + -1;
                    bVar17 = bVar76;
                  } while (iVar68 != 0);
                }
                bVar20 = iVar39 != iVar89;
                iVar39 = iVar39 + 1;
              } while (bVar20);
            }
            bVar20 = iVar81 != iVar109;
            iVar81 = iVar81 + 1;
          } while (bVar20);
        }
        if (bVar16 <= bVar76) {
          bVar16 = bVar76;
        }
        MFIter::operator++((MFIter *)local_10e8);
      } while ((int)local_10e8._32_4_ < (int)local_10e8._40_4_);
    }
    MFIter::~MFIter((MFIter *)local_10e8);
    local_10e8[0] = bVar16;
    ParallelDescriptor::ReduceBoolOr((bool *)local_10e8);
    iVar83 = 1;
    if ((bool)local_10e8[0] == false) {
      local_c98 = &this->m_cellflag;
      local_10e8._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_10e8._8_8_ = 0;
      local_10e8._16_8_ = 0;
      local_10e8._24_8_ = 0;
      local_10e8._32_8_ = 0;
      local_1128.p = (EBCellFlag *)&PTR__FabFactory_0080c088;
      local_1218._0_8_ = (_func_int **)0x200000002;
      local_1218._8_4_ = 2;
      (*(this->m_cellflag).super_FabArrayBase._vptr_FabArrayBase[3])
                (local_c98,this_01,dm,1,(FabFactory<amrex::FArrayBox> *)local_1218,local_10e8,
                 &local_1128);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_10e8 + 0x10));
      local_e98 = &(this->m_volfrac).super_FabArray<amrex::FArrayBox>;
      local_10e8._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_10e8._8_8_ = 0;
      local_10e8._16_8_ = 0;
      local_10e8._24_8_ = 0;
      local_10e8._32_8_ = 0;
      local_1218._0_8_ = &PTR__FabFactory_0080b918;
      MultiFab::define((MultiFab *)local_e98,this_01,dm,1,2,(MFInfo *)local_10e8,
                       (FabFactory<amrex::FArrayBox> *)local_1218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_10e8 + 0x10));
      local_ca0 = &(this->m_centroid).super_FabArray<amrex::FArrayBox>;
      local_10e8._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_10e8._8_8_ = 0;
      local_10e8._16_8_ = 0;
      local_10e8._24_8_ = 0;
      local_10e8._32_8_ = 0;
      local_1218._0_8_ = &PTR__FabFactory_0080b918;
      MultiFab::define((MultiFab *)local_ca0,this_01,dm,3,2,(MFInfo *)local_10e8,
                       (FabFactory<amrex::FArrayBox> *)local_1218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_10e8 + 0x10));
      local_ca8 = &(this->m_bndryarea).super_FabArray<amrex::FArrayBox>;
      local_10e8._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_10e8._8_8_ = 0;
      local_10e8._16_8_ = 0;
      local_10e8._24_8_ = 0;
      local_10e8._32_8_ = 0;
      local_1218._0_8_ = &PTR__FabFactory_0080b918;
      MultiFab::define((MultiFab *)local_ca8,this_01,dm,1,2,(MFInfo *)local_10e8,
                       (FabFactory<amrex::FArrayBox> *)local_1218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_10e8 + 0x10));
      local_cb0 = &(this->m_bndrycent).super_FabArray<amrex::FArrayBox>;
      local_10e8._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_10e8._8_8_ = 0;
      local_10e8._16_8_ = 0;
      local_10e8._24_8_ = 0;
      local_10e8._32_8_ = 0;
      local_1218._0_8_ = &PTR__FabFactory_0080b918;
      MultiFab::define((MultiFab *)local_cb0,this_01,dm,3,2,(MFInfo *)local_10e8,
                       (FabFactory<amrex::FArrayBox> *)local_1218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_10e8 + 0x10));
      local_cb8 = &(this->m_bndrynorm).super_FabArray<amrex::FArrayBox>;
      local_10e8._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      local_10e8._8_8_ = (FabArrayBase *)0x0;
      local_10e8._16_8_ = 0;
      local_10e8._24_8_ = 0;
      local_10e8._32_8_ = 0;
      local_1218._0_8_ = &PTR__FabFactory_0080b918;
      MultiFab::define((MultiFab *)local_cb8,this_01,dm,3,2,(MFInfo *)local_10e8,
                       (FabFactory<amrex::FArrayBox> *)local_1218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_10e8 + 0x10));
      local_cc0 = (FabArray<amrex::FArrayBox> *)&this->m_areafrac;
      local_cc8 = (FabArray<amrex::FArrayBox> *)&this->m_facecent;
      local_cd0 = (FabArray<amrex::FArrayBox> *)&this->m_edgecent;
      lVar94 = 0xd48;
      local_1350 = 0x11c8;
      lVar53 = 0x1648;
      lVar51 = 0;
      do {
        iVar83 = (int)lVar51;
        if (iVar83 == 1) {
          local_1128.jstride._0_4_ = 0;
          local_1128.p = (EBCellFlag *)0x100000000;
        }
        else if (iVar83 == 0) {
          local_1128.p = (EBCellFlag *)0x1;
          local_1128.jstride._0_4_ = 0;
        }
        else {
          local_1128.jstride._0_4_ = 1;
          local_1128.p = (EBCellFlag *)0x0;
        }
        plVar99 = (long *)((long)(this->m_geom).super_CoordSys.offset + lVar94 + -8);
        convert((BoxArray *)local_10e8,this_01,(IntVect *)&local_1128);
        local_1218._0_8_ = (_func_int **)0x1;
        local_1200 = (pointer)0x0;
        uStack_11f8 = (pointer)0x0;
        local_1218._8_8_ = (Arena *)0x0;
        local_1218._16_8_ = (pointer)0x0;
        local_ef8.p = (double *)&PTR__FabFactory_0080b918;
        (**(code **)(*plVar99 + 0x10))(plVar99,(BoxArray *)local_10e8,dm,1,2,local_1218,&local_ef8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1218 + 0x10));
        BoxArray::~BoxArray((BoxArray *)local_10e8);
        if (iVar83 == 1) {
          local_1128.jstride._0_4_ = 0;
          local_1128.p = (EBCellFlag *)0x100000000;
        }
        else if (iVar83 == 0) {
          local_1128.p = (EBCellFlag *)0x1;
          local_1128.jstride._0_4_ = 0;
        }
        else {
          local_1128.jstride._0_4_ = 1;
          local_1128.p = (EBCellFlag *)0x0;
        }
        convert((BoxArray *)local_10e8,this_01,(IntVect *)&local_1128);
        local_1218._0_8_ = (_func_int **)0x1;
        local_1200 = (pointer)0x0;
        uStack_11f8 = (pointer)0x0;
        local_1218._8_8_ = (Arena *)0x0;
        local_1218._16_8_ = (pointer)0x0;
        local_ef8.p = (double *)&PTR__FabFactory_0080b918;
        (**(code **)(*(long *)((long)&(this->m_cellflag).super_FabArrayBase.boxarray.m_bat.m_op +
                              lVar94 + 0x2c) + 0x10))
                  ((long)(this->m_geom).super_CoordSys.offset + local_1350 + -8,
                   (BoxArray *)local_10e8,dm,2,2,local_1218,&local_ef8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1218 + 0x10));
        BoxArray::~BoxArray((BoxArray *)local_10e8);
        local_1128.p = (EBCellFlag *)0x100000001;
        local_1128.jstride._0_4_ = 1;
        *(undefined4 *)((long)&local_1128.p + lVar51 * 4) = 0;
        convert((BoxArray *)local_10e8,this_01,(IntVect *)&local_1128);
        local_1218._0_8_ = (_func_int **)0x1;
        local_1200 = (pointer)0x0;
        uStack_11f8 = (pointer)0x0;
        local_1218._8_8_ = (Arena *)0x0;
        local_1218._16_8_ = (pointer)0x0;
        local_ef8.p = (double *)&PTR__FabFactory_0080b918;
        (**(code **)(*(long *)((long)&(this->m_bndryarea).super_FabArray<amrex::FArrayBox>.
                                      super_FabArrayBase.boxarray.m_bat.m_op + lVar94 + 0x2c) + 0x10
                    ))((long)(this->m_geom).super_CoordSys.offset + lVar53 + -8,local_10e8,dm,1,2,
                       local_1218,&local_ef8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1218 + 0x10));
        BoxArray::~BoxArray((BoxArray *)local_10e8);
        lVar51 = lVar51 + 1;
        lVar94 = lVar94 + 0x180;
        local_1350 = local_1350 + 0x180;
        lVar53 = lVar53 + 0x180;
      } while (lVar51 != 3);
      local_1078 = &fineLevel->m_cellflag;
      local_11c0 = &(fineLevel->m_volfrac).super_FabArray<amrex::FArrayBox>;
      local_ea0 = &(fineLevel->m_centroid).super_FabArray<amrex::FArrayBox>;
      local_ea8 = &(fineLevel->m_bndryarea).super_FabArray<amrex::FArrayBox>;
      local_eb0 = &(fineLevel->m_bndrycent).super_FabArray<amrex::FArrayBox>;
      local_eb8 = &(fineLevel->m_bndrynorm).super_FabArray<amrex::FArrayBox>;
      local_1080 = (FabArray<amrex::FArrayBox> *)&fineLevel->m_areafrac;
      if (fill_boundary) {
        PVar122 = Geometry::periodicity(&fineLevel->m_geom);
        local_5b0.p = PVar122.period.vect._0_8_;
        local_5b0.jstride._0_4_ = PVar122.period.vect[2];
        FabArray<amrex::EBCellFlagFab>::FillBoundary<amrex::EBCellFlag>
                  (local_1078,(Periodicity *)&local_5b0,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_11c0,(Periodicity *)&local_5b0,false)
        ;
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_ea0,(Periodicity *)&local_5b0,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_ea8,(Periodicity *)&local_5b0,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_eb0,(Periodicity *)&local_5b0,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>(local_eb8,(Periodicity *)&local_5b0,false);
        lVar53 = 3;
        this_02 = local_1080;
        do {
          FabArray<amrex::FArrayBox>::FillBoundary<double>(this_02,(Periodicity *)&local_5b0,false);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    (this_02 + 3,(Periodicity *)&local_5b0,false);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    (this_02 + 6,(Periodicity *)&local_5b0,false);
          this_02 = this_02 + 1;
          lVar53 = lVar53 + -1;
        } while (lVar53 != 0);
        peVar13 = (fineLevel->m_covered_grids).m_ref.
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar13->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (peVar13->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          Periodicity::shiftIntVect
                    ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_5f0,
                     (Periodicity *)&local_5b0);
          local_d88.p = (double *)0x0;
          local_d88.jstride = 0;
          local_d88.kstride = 0;
          MFIter::MFIter((MFIter *)local_10e8,&local_11c0->super_FabArrayBase,'\0');
          if ((int)local_10e8._32_4_ < (int)local_10e8._40_4_) {
            do {
              FabArrayBase::fabbox
                        ((Box *)local_570,(FabArrayBase *)local_10e8._8_8_,
                         *(int *)(*(long *)local_10e8._56_8_ + (long)(int)local_10e8._32_4_ * 4));
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)local_1218,local_11c0,(MFIter *)local_10e8);
              FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                        (&local_1128,local_1078,(MFIter *)local_10e8);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_ef8,local_1080,(MFIter *)local_10e8);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_de8,
                         &(fineLevel->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                         (MFIter *)local_10e8);
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        (&local_630,
                         &(fineLevel->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                         (MFIter *)local_10e8);
              LVar19 = local_5f0.jstride;
              uVar65 = local_f38._24_4_;
              local_f38._24_4_ = local_570._24_4_;
              for (pdVar75 = local_5f0.p; local_570._24_4_ = local_f38._24_4_,
                  pdVar75 != (double *)LVar19; pdVar75 = (double *)((long)pdVar75 + 0xc)) {
                local_f38._0_8_ =
                     CONCAT44((int)((ulong)local_570._0_8_ >> 0x20) + (int)((ulong)*pdVar75 >> 0x20)
                              ,(int)local_570._0_8_ + SUB84(*pdVar75,0));
                local_f38._8_4_ = local_570._8_4_ + *(int *)(pdVar75 + 1);
                local_f38._12_4_ = local_570._12_4_ + *(int *)pdVar75;
                local_f38._16_4_ = local_570._16_4_ + *(int *)((long)pdVar75 + 4);
                local_f38._20_4_ = local_570._20_4_ + *(int *)(pdVar75 + 1);
                BoxArray::intersections
                          (local_11d8,(Box *)local_f38,
                           (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            *)&local_d88);
                uVar65 = local_f38._24_4_;
                for (pdVar54 = local_d88.p; pdVar54 != (double *)local_d88.jstride;
                    pdVar54 = pdVar54 + 4) {
                  uVar65 = *(uint *)((long)pdVar54 + 0x1c);
                  local_f38._0_4_ = *(int *)((long)pdVar54 + 4) - *(int *)pdVar75;
                  local_f38._4_4_ = *(int *)(pdVar54 + 1) - *(int *)((long)pdVar75 + 4);
                  local_f38._8_4_ = *(int *)((long)pdVar54 + 0xc) - *(int *)(pdVar75 + 1);
                  iVar83 = *(int *)(pdVar54 + 2) - *(int *)pdVar75;
                  iVar87 = *(int *)((long)pdVar54 + 0x14) - *(int *)((long)pdVar75 + 4);
                  iVar89 = *(int *)(pdVar54 + 3) - *(int *)(pdVar75 + 1);
                  local_f38._12_4_ = iVar83;
                  local_f38._16_4_ = iVar87;
                  local_f38._20_4_ = iVar89;
                  lVar53 = 0;
                  do {
                    if ((uVar65 >> ((uint)lVar53 & 0x1f) & 1) == 0) {
                      *(int *)(local_f38 + lVar53 * 4 + 0xc) =
                           *(int *)(local_f38 + lVar53 * 4 + 0xc) + 1;
                    }
                    lVar53 = lVar53 + 1;
                  } while (lVar53 != 3);
                  if ((int)local_f38._8_4_ <= (int)local_f38._20_4_) {
                    iVar109 = local_f38._8_4_;
                    do {
                      iVar81 = local_f38._4_4_;
                      if ((int)local_f38._4_4_ <= (int)local_f38._16_4_) {
                        do {
                          if ((int)local_f38._0_4_ <= (int)local_f38._12_4_) {
                            iVar101 = local_f38._0_4_;
                            do {
                              if (((int)local_f38._0_4_ <= iVar101) &&
                                 ((int)local_f38._4_4_ <= iVar81)) {
                                if ((((int)local_f38._8_4_ <= iVar109) &&
                                    ((iVar101 <= iVar83 && (iVar81 <= iVar87)))) &&
                                   (iVar109 <= iVar89)) {
                                  *(_func_int **)
                                   (local_1218._0_8_ +
                                   (((long)iVar81 - (long)uStack_11f8._4_4_) * local_1218._8_8_ +
                                   (long)(iVar101 - (int)uStack_11f8) +
                                   ((long)iVar109 - (long)local_11f0) * local_1218._16_8_) * 8) =
                                       (_func_int *)0x0;
                                  local_1128.p
                                  [((long)iVar81 - (long)local_1128.begin.y) *
                                   CONCAT44(local_1128.jstride._4_4_,(undefined4)local_1128.jstride)
                                   + (long)(iVar101 - local_1128.begin.x) +
                                     ((long)iVar109 - (long)local_1128.begin.z) * local_1128.kstride
                                  ].flag = 0x40003;
                                }
                                if (((((int)local_f38._8_4_ <= iVar109) &&
                                     (iVar101 <= (int)((~uVar65 & 1) + iVar83))) &&
                                    (iVar81 <= iVar87)) && (iVar109 <= iVar89)) {
                                  local_ef8.p
                                  [((long)iVar81 - (long)local_ef8.begin.y) *
                                   CONCAT44(local_ef8.jstride._4_4_,(int)local_ef8.jstride) +
                                   (long)(iVar101 - local_ef8.begin.x) +
                                   ((long)iVar109 - (long)local_ef8.begin.z) *
                                   CONCAT44(local_ef8.kstride._4_4_,(int)local_ef8.kstride)] = 0.0;
                                }
                                if ((((int)local_f38._8_4_ <= iVar109) && (iVar101 <= iVar83)) &&
                                   ((iVar81 <= (int)(iVar87 + (uint)((uVar65 & 2) == 0)) &&
                                    (iVar109 <= iVar89)))) {
                                  *(undefined8 *)
                                   (CONCAT44(local_de8.p._4_4_,(int)local_de8.p) +
                                    ((long)iVar81 - (long)local_de8.begin.y) *
                                    CONCAT44(local_de8.jstride._4_4_,(int)local_de8.jstride) * 8 +
                                    (long)(iVar101 - local_de8.begin.x) * 8 +
                                   ((long)iVar109 - (long)local_de8.begin.z) *
                                   CONCAT44(local_de8.kstride._4_4_,(int)local_de8.kstride) * 8) = 0
                                  ;
                                }
                                if ((((int)local_f38._8_4_ <= iVar109) && (iVar101 <= iVar83)) &&
                                   ((iVar81 <= iVar87 &&
                                    (iVar109 <= (int)(iVar89 + (uint)((uVar65 & 4) == 0)))))) {
                                  local_630.p
                                  [((long)iVar81 - (long)local_630.begin.y) * local_630.jstride +
                                   (long)(iVar101 - local_630.begin.x) +
                                   ((long)iVar109 - (long)local_630.begin.z) * local_630.kstride] =
                                       0.0;
                                }
                              }
                              iVar101 = iVar101 + 1;
                            } while (local_f38._12_4_ + 1 != iVar101);
                          }
                          bVar20 = iVar81 != local_f38._16_4_;
                          iVar81 = iVar81 + 1;
                        } while (bVar20);
                      }
                      bVar20 = iVar109 != local_f38._20_4_;
                      iVar109 = iVar109 + 1;
                    } while (bVar20);
                  }
                }
                local_f38._24_4_ = local_570._24_4_;
              }
              local_f38._24_4_ = uVar65;
              MFIter::operator++((MFIter *)local_10e8);
            } while ((int)local_10e8._32_4_ < (int)local_10e8._40_4_);
          }
          MFIter::~MFIter((MFIter *)local_10e8);
          if (local_d88.p != (double *)0x0) {
            operator_delete(local_d88.p,local_d88.kstride - (long)local_d88.p);
          }
          if (local_5f0.p != (double *)0x0) {
            operator_delete(local_5f0.p,local_5f0.kstride - (long)local_5f0.p);
          }
        }
      }
      MFIter::MFIter((MFIter *)local_10e8,&local_e98->super_FabArrayBase,true);
      bVar20 = false;
      if ((int)local_10e8._32_4_ < (int)local_10e8._40_4_) {
        local_cd8 = (FabArray<amrex::FArrayBox> *)&fineLevel->m_facecent;
        local_ce0 = (FabArray<amrex::FArrayBox> *)&fineLevel->m_edgecent;
        local_cf0 = &(this->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_d00 = &(this->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_d10 = &(this->m_facecent)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_d20 = &(this->m_facecent)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_d30 = &(this->m_edgecent)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_d40 = &(this->m_edgecent)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_ce8 = &(fineLevel->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_cf8 = &(fineLevel->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_d08 = &(fineLevel->m_facecent)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_d18 = &(fineLevel->m_facecent)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        local_d28 = &(fineLevel->m_edgecent)._M_elems[1].super_FabArray<amrex::FArrayBox>;
        local_d38 = &(fineLevel->m_edgecent)._M_elems[2].super_FabArray<amrex::FArrayBox>;
        uVar65 = 0;
        do {
          local_1008 = uVar65;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_1218,local_e98,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&local_1128,local_ca0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_ef8,local_ca8,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_de8,local_cb0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_630,local_cb8,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_570,local_cc0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_f38,local_cf0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_5f0,local_d00,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_d88,local_cc8,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_5b0,local_d10,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_3b0,local_d20,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_70,local_cd0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_b0,local_d30,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_f0,local_d40,(MFIter *)local_10e8);
          FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                    (&local_130,local_c98,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_170,local_11c0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_3f0,local_ea0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1b0,local_ea8,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_430,local_eb0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_470,local_eb8,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1f0,local_1080,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_230,local_ce8,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_270,local_cf8,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_4b0,local_cd8,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_4f0,local_d08,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_530,local_d18,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_2b0,local_ce0,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_2f0,local_d28,(MFIter *)local_10e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_330,local_d38,(MFIter *)local_10e8);
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_370,local_1078,(MFIter *)local_10e8);
          BATransformer::operator()
                    (&local_da4,(BATransformer *)(local_10e8._8_8_ + 8),
                     (Box *)((long)*(int *)(*(long *)local_10e8._56_8_ +
                                           (long)(int)local_10e8._32_4_ * 4) * 0x1c +
                            *(long *)&(((((shared_ptr<amrex::BARef> *)(local_10e8._8_8_ + 0x50))->
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          MFIter::grownnodaltilebox(&local_64c,(MFIter *)local_10e8,-1,2);
          uVar23 = 0;
          local_fd4 = local_64c.bigend.vect[2];
          if (local_64c.smallend.vect[2] <= local_64c.bigend.vect[2]) {
            local_1178 = local_1128.nstride * 0x10;
            local_1180 = local_de8.nstride * 0x10;
            local_1188 = local_630.nstride * 0x10;
            uVar65 = local_da4.btype.itype & 1;
            local_f40 = ((local_da4.btype.itype & 2) >> 1 ^ 1) + local_da4.bigend.vect[1];
            local_f4c = ((local_da4.btype.itype & 4) >> 2 ^ 1) + local_da4.bigend.vect[2];
            iVar83 = local_da4.bigend.vect[0] + 2;
            local_f50 = local_da4.bigend.vect[0] + 3;
            if (uVar65 != 0) {
              local_f50 = iVar83;
            }
            iVar87 = local_da4.bigend.vect[1] + 2;
            local_f54 = local_da4.bigend.vect[1] + 3;
            if ((local_da4.btype.itype & 2) != 0) {
              local_f54 = iVar87;
            }
            iVar89 = local_da4.bigend.vect[2] + 2;
            local_f60 = local_da4.bigend.vect[2] + 3;
            if ((local_da4.btype.itype & 4) != 0) {
              local_f60 = iVar89;
            }
            local_f3c = local_da4.bigend.vect[0] - uVar65;
            local_f58 = iVar83 - uVar65;
            uVar66 = local_da4.btype.itype >> 1 & 1;
            uVar23 = local_da4.btype.itype >> 2 & 1;
            local_f44 = local_da4.bigend.vect[1] - uVar66;
            local_f5c = iVar87 - uVar66;
            local_f48 = local_da4.bigend.vect[2] - uVar23;
            local_f64 = iVar89 - uVar23;
            local_11c4 = (uVar66 ^ 1) + local_da4.bigend.vect[1] + 2;
            iVar67 = (uVar66 ^ 1) + local_da4.bigend.vect[1];
            local_11c8 = (uVar23 ^ 1) + local_da4.bigend.vect[2] + 2;
            iVar101 = (uVar23 ^ 1) + local_da4.bigend.vect[2];
            local_11d8 = (BoxArray *)CONCAT44(local_11d8._4_4_,iVar101);
            iVar24 = (uVar65 ^ 1) + local_da4.bigend.vect[0];
            iVar25 = (uVar65 ^ 1) + local_da4.bigend.vect[0] + 2;
            uVar65 = -local_630.begin.x;
            local_1190 = (ulong)uVar65;
            uVar66 = -local_de8.begin.x;
            local_1198 = (ulong)uVar66;
            uVar26 = -local_ef8.begin.x;
            local_11a0 = (ulong)uVar26;
            uVar27 = -local_1128.begin.x;
            local_11a8 = (ulong)uVar27;
            uVar28 = -(int)uStack_11f8;
            local_11b0 = (ulong)uVar28;
            uVar29 = -local_130.begin.x;
            local_1068 = (ulong)uVar29;
            uVar30 = -local_d88.begin.x;
            local_1050 = (ulong)uVar30;
            uVar31 = -local_550;
            local_e38 = (ulong)uVar31;
            uVar32 = -local_5b0.begin.x;
            local_1048 = (ulong)uVar32;
            uVar33 = -local_f18;
            local_e30 = (ulong)uVar33;
            uVar34 = -local_3b0.begin.x;
            local_1028 = (ulong)uVar34;
            uVar35 = -local_5f0.begin.x;
            local_e28 = (ulong)uVar35;
            uVar36 = -local_70.begin.x;
            local_e20 = (ulong)uVar36;
            uVar37 = -local_b0.begin.x;
            local_e18 = (ulong)uVar37;
            local_660 = (ulong)(uint)-local_f0.begin.x;
            local_f68 = -local_270.begin.x;
            local_f6c = -local_230.begin.x;
            local_f70 = -local_1f0.begin.x;
            local_f74 = -local_470.begin.x;
            local_f78 = -local_430.begin.x;
            local_f7c = -local_1b0.begin.x;
            local_f80 = -local_3f0.begin.x;
            local_f84 = -local_170.begin.x;
            local_f88 = -local_370.begin.x;
            local_f8c = -local_4b0.begin.x;
            local_f90 = -local_4f0.begin.x;
            local_f94 = -local_530.begin.x;
            local_f98 = -local_2b0.begin.x;
            local_f9c = -local_2f0.begin.x;
            local_fa0 = -local_330.begin.x;
            local_a88 = (_func_int **)local_1218._0_8_;
            local_898 = (Arena *)local_1218._8_8_;
            local_a90 = (pointer)local_1218._16_8_;
            local_8a0 = (long)uStack_11f8._4_4_;
            local_a98 = (long)local_11f0;
            local_aa0 = local_1128.p;
            local_8a8 = CONCAT44(local_1128.jstride._4_4_,(undefined4)local_1128.jstride);
            local_8b0 = (long)local_1128.begin.y;
            local_ab0 = (long)local_1128.begin.z;
            local_ab8 = (undefined **)local_ef8.p;
            local_8c0 = (long)local_ef8.begin.y;
            local_ac8 = (long)local_ef8.begin.z;
            local_8d0 = (long)local_de8.begin.y;
            local_ae0 = (long)local_de8.begin.z;
            local_8e0 = (long)local_630.begin.y;
            local_af8 = (long)local_630.begin.z;
            local_8f0 = (long)local_54c;
            local_b10 = (long)local_548;
            local_b18 = (double *)local_f38._0_8_;
            local_8f8 = CONCAT44(local_f38._12_4_,local_f38._8_4_);
            local_b20 = CONCAT44(local_f38._20_4_,local_f38._16_4_);
            local_900 = (long)local_f14;
            local_b28 = (long)local_f10;
            local_910 = (long)local_5f0.begin.y;
            local_b40 = (long)local_5f0.begin.z;
            local_b48 = local_d88.p;
            local_918 = (double *)local_d88.jstride;
            local_b50 = local_d88.kstride;
            local_920 = (long)local_d88.begin.y;
            local_b58 = (long)local_d88.begin.z;
            local_b60 = local_5b0.p;
            local_928 = CONCAT44(local_5b0.jstride._4_4_,(int)local_5b0.jstride);
            local_930 = (long)local_5b0.begin.y;
            local_b70 = (long)local_5b0.begin.z;
            local_940 = (long)local_3b0.begin.y;
            local_b88 = (long)local_3b0.begin.z;
            local_950 = (long)local_70.begin.y;
            local_ba0 = (long)local_70.begin.z;
            local_960 = (long)local_b0.begin.y;
            local_bb8 = (long)local_b0.begin.z;
            local_970 = (long)local_f0.begin.y;
            local_bd0 = (long)local_f0.begin.z;
            local_980 = (long)local_130.begin.y;
            local_be8 = (long)local_130.begin.z;
            local_a28 = (long)local_4f0.begin.y;
            local_c50 = (long)local_530.begin.z;
            local_a40 = (long)local_2b0.begin.y;
            local_c68 = (long)local_2b0.begin.z;
            local_c80 = (long)local_2f0.begin.z;
            local_a60 = (long)local_330.begin.y;
            local_1070 = (ulong)(uint)local_64c.smallend.vect[0];
            local_800 = (ulong)(uint)local_64c.bigend.vect[0];
            local_788 = local_3f0.nstride * 2;
            local_790 = local_430.nstride * 2;
            iVar68 = local_da4.smallend.vect[0] + -2;
            iVar38 = local_da4.smallend.vect[1] + -2;
            iVar39 = local_da4.smallend.vect[2] + -2;
            local_798 = local_470.nstride * 2;
            local_1130 = CONCAT44(local_1130._4_4_,local_64c.bigend.vect[0] + 1U);
            iVar109 = local_64c.smallend.vect[0] * 2;
            uVar23 = 0;
            iVar81 = local_64c.smallend.vect[2];
            do {
              if (local_64c.smallend.vect[1] <= local_64c.bigend.vect[1]) {
                lVar94 = (long)iVar81;
                iVar14 = (int)(lVar94 * 2);
                iVar69 = iVar14 + 1;
                local_718 = (iVar14 - local_370.begin.z) * local_370.kstride;
                lVar53 = (iVar69 - local_370.begin.z) * local_370.kstride;
                local_808 = local_130.p + (lVar94 - local_be8) * local_130.kstride;
                local_810 = (_func_int **)
                            (local_1218._0_8_ + (lVar94 - local_a98) * local_1218._16_8_ * 8);
                local_818 = local_1128.p + (lVar94 - local_ab0) * local_1128.kstride * 2;
                local_820 = (undefined **)
                            (local_ef8.p +
                            (lVar94 - local_ac8) *
                            CONCAT44(local_ef8.kstride._4_4_,(int)local_ef8.kstride));
                local_828 = CONCAT44(local_de8.p._4_4_,(int)local_de8.p) +
                            (lVar94 - local_ae0) *
                            CONCAT44(local_de8.kstride._4_4_,(int)local_de8.kstride) * 8;
                local_830 = local_630.p + (lVar94 - local_af8) * local_630.kstride;
                local_720 = (iVar14 - local_170.begin.z) * local_170.kstride;
                local_728 = (iVar69 - local_170.begin.z) * local_170.kstride;
                local_730 = (iVar14 - local_3f0.begin.z) * local_3f0.kstride;
                local_738 = (iVar69 - local_3f0.begin.z) * local_3f0.kstride;
                local_740 = (iVar14 - local_1b0.begin.z) * local_1b0.kstride;
                local_748 = (iVar69 - local_1b0.begin.z) * local_1b0.kstride;
                local_750 = (iVar14 - local_430.begin.z) * local_430.kstride;
                local_758 = (iVar69 - local_430.begin.z) * local_430.kstride;
                local_760 = (iVar14 - local_470.begin.z) * local_470.kstride;
                local_768 = (iVar69 - local_470.begin.z) * local_470.kstride;
                lVar51 = (iVar14 - local_1f0.begin.z) * local_1f0.kstride;
                local_e58 = (iVar69 - local_1f0.begin.z) * local_1f0.kstride;
                lVar103 = (iVar14 - local_230.begin.z) * local_230.kstride;
                local_e60 = (iVar69 - local_230.begin.z) * local_230.kstride;
                local_e80 = local_270.kstride * (iVar14 - local_270.begin.z);
                local_e90 = ((iVar14 - local_270.begin.z) + 2) * local_270.kstride;
                local_838 = (double *)
                            (local_570._0_8_ +
                            (lVar94 - local_b10) * CONCAT44(local_570._20_4_,local_570._16_4_) * 8);
                local_840 = (long)local_d88.p +
                            ((lVar94 - local_b58) * local_d88.kstride * 2 + -1) * 4 + 4;
                local_7e8 = (iVar14 - local_4b0.begin.z) * local_4b0.kstride;
                local_7f0 = (iVar69 - local_4b0.begin.z) * local_4b0.kstride;
                local_848 = (double *)(local_f38._0_8_ + (lVar94 - local_b28) * local_b20 * 8);
                local_850 = local_5b0.p + (lVar94 - local_b70) * local_5b0.kstride;
                local_7d0 = (iVar14 - local_4f0.begin.z) * local_4f0.kstride;
                local_7d8 = (iVar69 - local_4f0.begin.z) * local_4f0.kstride;
                local_858 = local_5f0.p + (lVar94 - local_b40) * local_5f0.kstride;
                local_860 = local_3b0.p + (lVar94 - local_b88) * local_3b0.kstride;
                local_868 = local_70.p + (lVar94 - local_ba0) * local_70.kstride;
                local_870 = local_2f0.p + (iVar14 - local_c80) * local_2f0.kstride;
                local_878 = local_b0.p + (lVar94 - local_bb8) * local_b0.kstride;
                local_6b8 = (iVar14 - local_330.begin.z) * local_330.kstride;
                local_6c0 = (iVar69 - local_330.begin.z) * local_330.kstride;
                local_880 = local_f0.p + (lVar94 - local_bd0) * local_f0.kstride;
                local_888 = local_530.p + (lVar94 * 2 - local_c50) * local_530.kstride;
                local_890 = local_2b0.p + (iVar14 - local_c68) * local_2b0.kstride;
                iVar14 = local_64c.smallend.vect[1];
                do {
                  if (local_64c.smallend.vect[0] <= local_64c.bigend.vect[0]) {
                    lVar94 = (long)iVar14;
                    iVar69 = (int)(lVar94 * 2);
                    iVar70 = iVar69 + 1;
                    local_1058 = local_370.p + (iVar69 - local_370.begin.y) * local_370.jstride;
                    local_11b8 = local_370.p + (iVar70 - local_370.begin.y) * local_370.jstride;
                    local_1060 = local_808 + (lVar94 - local_980) * local_130.jstride;
                    local_1138 = local_810 + (lVar94 - local_8a0) * local_1218._8_8_;
                    local_1140 = local_818 + (lVar94 - local_8b0) * local_8a8 * 2;
                    local_1148 = local_820 +
                                 (lVar94 - local_8c0) *
                                 CONCAT44(local_ef8.jstride._4_4_,(int)local_ef8.jstride);
                    local_1150 = local_828 +
                                 (lVar94 - local_8d0) *
                                 CONCAT44(local_de8.jstride._4_4_,(int)local_de8.jstride) * 8;
                    local_1158 = local_830 + (lVar94 - local_8e0) * local_630.jstride;
                    local_6c8 = local_170.p + (iVar69 - local_170.begin.y) * local_170.jstride;
                    local_6d0 = local_170.p + (iVar70 - local_170.begin.y) * local_170.jstride;
                    local_6d8 = local_3f0.p + (iVar69 - local_3f0.begin.y) * local_3f0.jstride;
                    local_6e0 = local_3f0.p + (iVar70 - local_3f0.begin.y) * local_3f0.jstride;
                    local_6e8 = local_1b0.p + (iVar69 - local_1b0.begin.y) * local_1b0.jstride;
                    local_6f0 = local_1b0.p + (iVar70 - local_1b0.begin.y) * local_1b0.jstride;
                    local_6f8 = local_430.p + (iVar69 - local_430.begin.y) * local_430.jstride;
                    local_700 = local_430.p + (iVar70 - local_430.begin.y) * local_430.jstride;
                    local_708 = local_470.p + (iVar69 - local_470.begin.y) * local_470.jstride;
                    local_710 = local_470.p + (iVar70 - local_470.begin.y) * local_470.jstride;
                    local_e40 = local_1f0.p + (iVar69 - local_1f0.begin.y) * local_1f0.jstride;
                    local_e48 = local_1f0.p + (iVar70 - local_1f0.begin.y) * local_1f0.jstride;
                    local_e50 = local_230.p + local_230.jstride * (iVar69 - local_230.begin.y);
                    local_e88 = local_230.p + ((iVar69 - local_230.begin.y) + 2) * local_230.jstride
                    ;
                    local_a78 = local_270.p + (iVar69 - local_270.begin.y) * local_270.jstride;
                    local_a80 = local_270.p + (iVar70 - local_270.begin.y) * local_270.jstride;
                    local_e10 = local_838 +
                                (lVar94 - local_8f0) * CONCAT44(local_570._12_4_,local_570._8_4_);
                    local_1020 = local_840 + (lVar94 - local_920) * local_d88.jstride * 8;
                    local_7b8 = local_4b0.p + (iVar69 - local_4b0.begin.y) * local_4b0.jstride;
                    local_7c0 = local_4b0.p + (iVar70 - local_4b0.begin.y) * local_4b0.jstride;
                    local_e08 = local_848 + (lVar94 - local_900) * local_8f8;
                    local_1018 = local_850 + (lVar94 - local_930) * local_928;
                    local_7b0 = local_4f0.p + (lVar94 * 2 - local_a28) * local_4f0.jstride;
                    local_e00 = local_858 + (lVar94 - local_910) * local_5f0.jstride;
                    local_1010 = local_860 + (lVar94 - local_940) * local_3b0.jstride;
                    local_7a0 = local_888 + (iVar69 - local_530.begin.y) * local_530.jstride;
                    local_7a8 = local_888 + (iVar70 - local_530.begin.y) * local_530.jstride;
                    local_690 = local_890 + (iVar69 - local_a40) * local_2b0.jstride;
                    local_df8 = local_868 + (lVar94 - local_950) * local_70.jstride;
                    local_680 = local_870 + (iVar69 - local_2f0.begin.y) * local_2f0.jstride;
                    local_688 = local_870 + (iVar70 - local_2f0.begin.y) * local_2f0.jstride;
                    local_df0 = local_878 + (lVar94 - local_960) * local_b0.jstride;
                    local_678 = local_330.p + (iVar69 - local_a60) * local_330.jstride;
                    local_658 = local_880 + (lVar94 - local_970) * local_f0.jstride;
                    local_698 = local_a80 + local_e80;
                    local_6b0 = local_1020 + local_d88.nstride * 8;
                    local_6a8 = local_1018 + local_5b0.nstride;
                    local_6a0 = local_1010 + local_3b0.nstride;
                    uVar104 = local_1070;
                    iVar69 = local_f6c;
                    iVar70 = local_f90;
                    iVar88 = local_f98;
                    iVar90 = local_fa0;
                    iVar97 = local_f9c;
                    iVar106 = local_f94;
                    iVar110 = local_f8c;
                    uVar15 = uVar23;
                    iVar50 = local_f88;
                    iVar49 = local_f84;
                    iVar48 = local_f80;
                    iVar47 = local_f7c;
                    iVar46 = local_f78;
                    iVar45 = local_f74;
                    iVar44 = local_f70;
                    iVar43 = local_f68;
                    do {
                      iVar102 = (int)uVar104;
                      if ((iVar102 < local_da4.smallend.vect[0]) ||
                         (((iVar81 < local_da4.smallend.vect[2] ||
                           iVar14 < local_da4.smallend.vect[1]) ||
                          (local_da4.bigend.vect[0] < iVar102 || local_da4.bigend.vect[1] < iVar14))
                          || local_da4.bigend.vect[2] < iVar81)) {
                        if ((iVar68 <= iVar102) &&
                           (((iVar39 <= iVar81 && iVar38 <= iVar14) &&
                            (iVar102 <= iVar83 && iVar14 <= iVar87)) && iVar81 <= iVar89)) {
                          local_1138[(int)(uVar28 + iVar102)] = (_func_int *)0x3ff0000000000000;
                          lVar94 = (long)(int)(uVar27 + iVar102);
                          *(undefined8 *)(local_1140 + lVar94 * 2) = 0;
                          *(undefined8 *)(local_1140 + lVar94 * 2 + local_1128.nstride * 2) = 0;
                          *(undefined8 *)(local_1140 + lVar94 * 2 + local_1128.nstride * 4) = 0;
                          local_1148[(int)(uVar26 + iVar102)] = (undefined *)0x0;
                          *(undefined8 *)(local_1150 + (long)(int)(uVar66 + iVar102) * 8) =
                               0xbff0000000000000;
                          lVar94 = local_1150 + (long)(int)(uVar66 + iVar102) * 8;
                          *(undefined8 *)(lVar94 + local_de8.nstride * 8) = 0xbff0000000000000;
                          *(undefined8 *)(local_1180 + lVar94) = 0xbff0000000000000;
                          lVar94 = (long)(int)(uVar65 + iVar102);
                          local_1158[lVar94] = 0.0;
                          local_1158[lVar94 + local_630.nstride] = 0.0;
                          local_1158[lVar94 + local_630.nstride * 2] = 0.0;
                        }
                        uVar23 = 0;
                        uVar40 = 0;
                        if (local_da4.smallend.vect[0] <= iVar102) goto LAB_00614bb5;
LAB_00614e06:
                        uVar23 = uVar40;
                        if ((iVar68 <= iVar102) &&
                           (((iVar39 <= iVar81 && iVar38 <= iVar14) &&
                            (iVar102 <= local_f50 && iVar14 <= iVar87)) && iVar81 <= iVar89)) {
                          local_e10[(int)(uVar31 + iVar102)] = 1.0;
                          puVar7 = (undefined8 *)(local_1020 + (long)(int)(uVar30 + iVar102) * 8);
                          *puVar7 = 0;
                          puVar7[local_d88.nstride] = 0;
                        }
                        if (local_da4.smallend.vect[0] <= iVar102) goto LAB_00614f03;
LAB_00615151:
                        if ((iVar68 <= iVar102) &&
                           (((iVar39 <= iVar81 && iVar38 <= iVar14) &&
                            (iVar102 <= iVar83 && iVar14 <= local_f54)) && iVar81 <= iVar89)) {
                          local_e08[(int)(uVar33 + iVar102)] = 1.0;
                          local_1018[(int)(uVar32 + iVar102)] = 0.0;
                          (local_1018 + (int)(uVar32 + iVar102))[local_5b0.nstride] = 0.0;
                        }
                        if (local_da4.smallend.vect[0] <= iVar102) goto LAB_00615249;
LAB_0061544f:
                        if (((iVar68 <= iVar102) && ((iVar102 <= iVar83 && (iVar38 <= iVar14)))) &&
                           ((iVar14 <= iVar87 && ((iVar39 <= iVar81 && (iVar81 <= local_f60)))))) {
                          local_e00[(int)(uVar35 + iVar102)] = 1.0;
                          local_1010[(int)(uVar34 + iVar102)] = 0.0;
                          (local_1010 + (int)(uVar34 + iVar102))[local_3b0.nstride] = 0.0;
                        }
                        if (local_da4.smallend.vect[0] <= iVar102) goto LAB_0061557c;
LAB_006156cb:
                        if ((((iVar68 <= iVar102) && ((iVar102 <= local_f58 && (iVar38 <= iVar14))))
                            && (iVar14 <= local_11c4)) &&
                           ((iVar39 <= iVar81 && (iVar81 <= local_11c8)))) {
                          local_df8[(int)(uVar36 + iVar102)] = 1.0;
                        }
                        if (local_da4.smallend.vect[0] <= iVar102) goto LAB_00615772;
LAB_006158c1:
                        if (((iVar68 <= iVar102) && ((iVar102 <= iVar25 && (iVar38 <= iVar14)))) &&
                           ((iVar14 <= local_f5c && ((iVar39 <= iVar81 && (iVar81 <= local_11c8)))))
                           ) {
                          local_df0[(int)(uVar37 + iVar102)] = 1.0;
                        }
                        if (local_da4.smallend.vect[0] <= iVar102) goto LAB_00615964;
LAB_006159de:
                        if ((((iVar68 <= iVar102) && ((iVar102 <= iVar25 && (iVar38 <= iVar14)))) &&
                            (iVar14 <= local_11c4)) &&
                           ((iVar39 <= iVar81 && (dVar116 = 1.0, iVar81 <= local_f64))))
                        goto LAB_00615aef;
                      }
                      else {
                        lVar94 = (long)(iVar50 + iVar109);
                        uVar23 = local_1058[lVar94 + local_718].flag & 3;
                        if (uVar23 == 3) {
                          lVar60 = (long)(iVar50 + iVar109 + 1);
                          if (((((~local_1058[lVar60 + local_718].flag & 3) != 0) ||
                               ((~local_11b8[lVar94 + local_718].flag & 3) != 0)) ||
                              ((~local_11b8[lVar60 + local_718].flag & 3) != 0)) ||
                             ((((~local_1058[lVar94 + lVar53].flag & 3) != 0 ||
                               ((~local_1058[lVar60 + lVar53].flag & 3) != 0)) ||
                              (((~local_11b8[lVar94 + lVar53].flag & 3) != 0 ||
                               ((~local_11b8[lVar60 + lVar53].flag & 3) != 0))))))
                          goto LAB_00613cdd;
                          local_1060[(int)(uVar29 + iVar102)].flag = 0x40003;
                          local_1138[(int)(uVar28 + iVar102)] = (_func_int *)0x0;
LAB_00613c22:
                          lVar94 = (long)(int)(uVar27 + iVar102);
                          *(undefined8 *)(local_1140 + lVar94 * 2) = 0;
                          *(undefined8 *)(local_1140 + lVar94 * 2 + local_1128.nstride * 2) = 0;
                          *(undefined8 *)(local_1140 + lVar94 * 2 + local_1128.nstride * 4) = 0;
                          local_1148[(int)(uVar26 + iVar102)] = (undefined *)0x0;
                          *(undefined8 *)(local_1150 + (long)(int)(uVar66 + iVar102) * 8) =
                               0xbff0000000000000;
                          lVar94 = local_1150 + (long)(int)(uVar66 + iVar102) * 8;
                          *(undefined8 *)(lVar94 + local_de8.nstride * 8) = 0xbff0000000000000;
                          *(undefined8 *)(local_1180 + lVar94) = 0xbff0000000000000;
                          lVar94 = (long)(int)(uVar65 + iVar102);
                          local_1158[lVar94] = 0.0;
                          local_1158[lVar94 + local_630.nstride] = 0.0;
                          local_1158[lVar94 + local_630.nstride * 2] = 0.0;
LAB_00614b84:
                          uVar23 = 0;
                        }
                        else {
                          if (uVar23 == 0) {
                            lVar60 = (long)(iVar50 + iVar109 + 1);
                            if ((((local_1058[lVar60 + local_718].flag & 3) == 0) &&
                                ((local_11b8[lVar94 + local_718].flag & 3) == 0)) &&
                               ((((local_11b8[lVar60 + local_718].flag & 3) == 0 &&
                                 ((((local_1058[lVar94 + lVar53].flag & 3) == 0 &&
                                   ((local_1058[lVar60 + lVar53].flag & 3) == 0)) &&
                                  ((local_11b8[lVar94 + lVar53].flag & 3) == 0)))) &&
                                ((local_11b8[lVar60 + lVar53].flag & 3) == 0)))) {
                              local_1060[(int)(uVar29 + iVar102)].flag =
                                   local_1060[(int)(uVar29 + iVar102)].flag & 0xffffffe0 | 4;
                              local_1138[(int)(uVar28 + iVar102)] = (_func_int *)0x3ff0000000000000;
                              goto LAB_00613c22;
                            }
                          }
LAB_00613cdd:
                          local_1060[(int)(uVar29 + iVar102)].flag =
                               local_1060[(int)(uVar29 + iVar102)].flag & 0xffffffe0 | 5;
                          lVar94 = (long)(iVar109 + iVar49);
                          lVar60 = (long)(iVar109 + 1 + iVar49);
                          p_Var114 = (_func_int *)
                                     ((local_6c8[lVar94 + local_720] + local_6c8[lVar60 + local_720]
                                       + local_6d0[lVar94 + local_720] +
                                       local_6d0[lVar60 + local_720] + local_6c8[lVar94 + local_728]
                                       + local_6c8[lVar60 + local_728] +
                                       local_6d0[lVar94 + local_728] + local_6d0[lVar60 + local_728]
                                      ) * 0.125);
                          local_1138[(int)(uVar28 + iVar102)] = p_Var114;
                          dVar116 = (1.0 / (double)p_Var114) * 0.125;
                          lVar71 = (long)(iVar109 + iVar48);
                          pdVar75 = local_6d8 + lVar71 + local_730;
                          lVar85 = (long)(iVar109 + 1 + iVar48);
                          pdVar54 = local_6d8 + lVar85 + local_730;
                          pdVar1 = local_6e0 + lVar71 + local_730;
                          pdVar2 = local_6e0 + lVar85 + local_730;
                          pdVar3 = local_6d8 + lVar71 + local_738;
                          pdVar4 = local_6d8 + lVar85 + local_738;
                          pdVar5 = local_6e0 + lVar71 + local_738;
                          pdVar6 = local_6e0 + lVar85 + local_738;
                          lVar71 = (long)(int)(uVar27 + iVar102);
                          *(double *)(local_1140 + lVar71 * 2) =
                               ((*pdVar6 * 0.5 + 0.25) * local_6d0[lVar60 + local_728] +
                               (*pdVar5 * 0.5 + -0.25) * local_6d0[lVar94 + local_728] +
                               (*pdVar4 * 0.5 + 0.25) * local_6c8[lVar60 + local_728] +
                               (*pdVar3 * 0.5 + -0.25) * local_6c8[lVar94 + local_728] +
                               (*pdVar2 * 0.5 + 0.25) * local_6d0[lVar60 + local_720] +
                               (*pdVar1 * 0.5 + -0.25) * local_6d0[lVar94 + local_720] +
                               (*pdVar75 * 0.5 + -0.25) * local_6c8[lVar94 + local_720] +
                               (*pdVar54 * 0.5 + 0.25) * local_6c8[lVar60 + local_720]) * dVar116;
                          *(double *)(local_1140 + lVar71 * 2 + local_1128.nstride * 2) =
                               ((pdVar6[local_3f0.nstride] * 0.5 + 0.25) *
                                local_6d0[lVar60 + local_728] +
                               (pdVar5[local_3f0.nstride] * 0.5 + 0.25) *
                               local_6d0[lVar94 + local_728] +
                               (pdVar4[local_3f0.nstride] * 0.5 + -0.25) *
                               local_6c8[lVar60 + local_728] +
                               (pdVar3[local_3f0.nstride] * 0.5 + -0.25) *
                               local_6c8[lVar94 + local_728] +
                               (pdVar2[local_3f0.nstride] * 0.5 + 0.25) *
                               local_6d0[lVar60 + local_720] +
                               (pdVar1[local_3f0.nstride] * 0.5 + 0.25) *
                               local_6d0[lVar94 + local_720] +
                               (pdVar75[local_3f0.nstride] * 0.5 + -0.25) *
                               local_6c8[lVar94 + local_720] +
                               (pdVar54[local_3f0.nstride] * 0.5 + -0.25) *
                               local_6c8[lVar60 + local_720]) * dVar116;
                          *(double *)(local_1140 + lVar71 * 2 + local_1128.nstride * 4) =
                               ((pdVar6[local_3f0.nstride * 2] * 0.5 + 0.25) *
                                local_6d0[lVar60 + local_728] +
                               (pdVar5[local_3f0.nstride * 2] * 0.5 + 0.25) *
                               local_6d0[lVar94 + local_728] +
                               (pdVar4[local_3f0.nstride * 2] * 0.5 + 0.25) *
                               local_6c8[lVar60 + local_728] +
                               (pdVar3[local_3f0.nstride * 2] * 0.5 + 0.25) *
                               local_6c8[lVar94 + local_728] +
                               (pdVar2[local_3f0.nstride * 2] * 0.5 + -0.25) *
                               local_6d0[lVar60 + local_720] +
                               (pdVar1[local_3f0.nstride * 2] * 0.5 + -0.25) *
                               local_6d0[lVar94 + local_720] +
                               (pdVar75[local_3f0.nstride * 2] * 0.5 + -0.25) *
                               local_6c8[lVar94 + local_720] +
                               (pdVar54[local_3f0.nstride * 2] * 0.5 + -0.25) *
                               local_6c8[lVar60 + local_720]) * dVar116;
                          lVar60 = (long)(iVar109 + iVar47);
                          lVar71 = (long)(iVar109 + 1 + iVar47);
                          puVar115 = (undefined *)
                                     ((local_6e8[lVar60 + local_740] + local_6e8[lVar71 + local_740]
                                       + local_6f0[lVar60 + local_740] +
                                       local_6f0[lVar71 + local_740] + local_6e8[lVar60 + local_748]
                                       + local_6e8[lVar71 + local_748] +
                                       local_6f0[lVar60 + local_748] + local_6f0[lVar71 + local_748]
                                      ) * 0.25);
                          local_1148[(int)(uVar26 + iVar102)] = puVar115;
                          lVar94 = (long)(iVar109 + iVar46);
                          pdVar75 = local_6f8 + lVar94 + local_750;
                          lVar85 = (long)(iVar109 + 1 + iVar46);
                          pdVar54 = local_6f8 + lVar85 + local_750;
                          dVar116 = (1.0 / (double)puVar115) * 0.25;
                          local_668 = local_700 + lVar94 + local_750;
                          local_670 = local_700 + lVar85 + local_750;
                          local_1030 = local_6f8 + lVar94 + local_758;
                          local_1038 = local_6f8 + lVar85 + local_758;
                          local_1040 = local_700 + lVar94 + local_758;
                          pdVar1 = local_700 + lVar85 + local_758;
                          *(double *)(local_1150 + (long)(int)(uVar66 + iVar102) * 8) =
                               ((*pdVar1 * 0.5 + 0.25) * local_6f0[lVar71 + local_748] +
                               (*local_1040 * 0.5 + -0.25) * local_6f0[lVar60 + local_748] +
                               (*local_1038 * 0.5 + 0.25) * local_6e8[lVar71 + local_748] +
                               (*local_1030 * 0.5 + -0.25) * local_6e8[lVar60 + local_748] +
                               (*local_670 * 0.5 + 0.25) * local_6f0[lVar71 + local_740] +
                               (*local_668 * 0.5 + -0.25) * local_6f0[lVar60 + local_740] +
                               (*pdVar75 * 0.5 + -0.25) * local_6e8[lVar60 + local_740] +
                               (*pdVar54 * 0.5 + 0.25) * local_6e8[lVar71 + local_740]) * dVar116;
                          lVar94 = local_1150 + (long)(int)(uVar66 + iVar102) * 8;
                          *(double *)(lVar94 + local_de8.nstride * 8) =
                               ((pdVar1[local_430.nstride] * 0.5 + 0.25) *
                                local_6f0[lVar71 + local_748] +
                               (local_1040[local_430.nstride] * 0.5 + 0.25) *
                               local_6f0[lVar60 + local_748] +
                               (local_1038[local_430.nstride] * 0.5 + -0.25) *
                               local_6e8[lVar71 + local_748] +
                               (local_1030[local_430.nstride] * 0.5 + -0.25) *
                               local_6e8[lVar60 + local_748] +
                               (local_670[local_430.nstride] * 0.5 + 0.25) *
                               local_6f0[lVar71 + local_740] +
                               (local_668[local_430.nstride] * 0.5 + 0.25) *
                               local_6f0[lVar60 + local_740] +
                               (pdVar75[local_430.nstride] * 0.5 + -0.25) *
                               local_6e8[lVar60 + local_740] +
                               (pdVar54[local_430.nstride] * 0.5 + -0.25) *
                               local_6e8[lVar71 + local_740]) * dVar116;
                          *(double *)(local_1180 + lVar94) =
                               ((pdVar1[local_430.nstride * 2] * 0.5 + 0.25) *
                                local_6f0[lVar71 + local_748] +
                               (local_1040[local_430.nstride * 2] * 0.5 + 0.25) *
                               local_6f0[lVar60 + local_748] +
                               (local_1038[local_430.nstride * 2] * 0.5 + 0.25) *
                               local_6e8[lVar71 + local_748] +
                               (local_1030[local_430.nstride * 2] * 0.5 + 0.25) *
                               local_6e8[lVar60 + local_748] +
                               (local_670[local_430.nstride * 2] * 0.5 + -0.25) *
                               local_6f0[lVar71 + local_740] +
                               (local_668[local_430.nstride * 2] * 0.5 + -0.25) *
                               local_6f0[lVar60 + local_740] +
                               (pdVar75[local_430.nstride * 2] * 0.5 + -0.25) *
                               local_6e8[lVar60 + local_740] +
                               (pdVar54[local_430.nstride * 2] * 0.5 + -0.25) *
                               local_6e8[lVar71 + local_740]) * dVar116;
                          lVar85 = (long)(iVar109 + iVar45);
                          pdVar75 = local_708 + lVar85 + local_760;
                          dVar116 = local_6e8[lVar60 + local_740];
                          lVar94 = (long)(iVar109 + 1 + iVar45);
                          dVar117 = local_6e8[lVar60 + local_748];
                          dVar118 = local_6e8[lVar71 + local_740];
                          dVar8 = local_6e8[lVar71 + local_748];
                          pdVar54 = local_708 + lVar94 + local_760;
                          dVar9 = local_6f0[lVar60 + local_740];
                          dVar10 = local_6f0[lVar60 + local_748];
                          pdVar1 = local_710 + lVar85 + local_760;
                          dVar11 = local_6f0[lVar71 + local_740];
                          dVar12 = local_6f0[lVar71 + local_748];
                          pdVar2 = local_710 + lVar94 + local_760;
                          pdVar3 = local_708 + lVar85 + local_768;
                          pdVar4 = local_708 + lVar94 + local_768;
                          pdVar5 = local_710 + lVar85 + local_768;
                          pdVar6 = local_710 + lVar94 + local_768;
                          dVar119 = *pdVar6 * dVar12 +
                                    *pdVar5 * dVar10 +
                                    *pdVar4 * dVar8 +
                                    *pdVar3 * dVar117 +
                                    *pdVar2 * dVar11 +
                                    *pdVar1 * dVar9 + *pdVar75 * dVar116 + *pdVar54 * dVar118;
                          dVar112 = dVar12 * pdVar6[local_470.nstride * 2] +
                                    dVar10 * pdVar5[local_470.nstride * 2] +
                                    dVar8 * pdVar4[local_470.nstride * 2] +
                                    dVar117 * pdVar3[local_470.nstride * 2] +
                                    dVar11 * pdVar2[local_470.nstride * 2] +
                                    dVar9 * pdVar1[local_470.nstride * 2] +
                                    dVar116 * pdVar75[local_470.nstride * 2] +
                                    pdVar54[local_470.nstride * 2] * dVar118;
                          dVar116 = dVar12 * pdVar6[local_470.nstride] +
                                    dVar10 * pdVar5[local_470.nstride] +
                                    dVar8 * pdVar4[local_470.nstride] +
                                    dVar117 * pdVar3[local_470.nstride] +
                                    dVar11 * pdVar2[local_470.nstride] +
                                    dVar9 * pdVar1[local_470.nstride] +
                                    dVar116 * pdVar75[local_470.nstride] +
                                    pdVar54[local_470.nstride] * dVar118;
                          dVar117 = 1.0 / SQRT(dVar112 * dVar112 +
                                               dVar119 * dVar119 + dVar116 * dVar116 + 1e-30);
                          local_1158[(int)(uVar65 + iVar102)] = dVar119 * dVar117;
                          pdVar75 = local_1158 + (int)(uVar65 + iVar102);
                          pdVar75[local_630.nstride] = dVar116 * dVar117;
                          pdVar75[local_630.nstride * 2] = dVar117 * dVar112;
                          if (((dVar119 != 0.0) || (NAN(dVar119))) ||
                             ((auVar113._8_8_ = -(ulong)(dVar116 == 0.0),
                              auVar113._0_8_ = -(ulong)(dVar112 == 0.0),
                              uVar40 = movmskpd((int)pdVar75,auVar113),
                              (byte)((byte)uVar40 >> 1) == 0 || (uVar23 = 1, (uVar40 & 1) == 0)))) {
                            lVar94 = (long)(iVar109 + iVar44);
                            uVar40 = 0;
                            uVar23 = 0;
                            if ((local_e40[lVar94 + lVar51] == 1.0) &&
                               (!NAN(local_e40[lVar94 + lVar51]))) {
                              lVar60 = (long)(iVar109 + iVar44 + 2);
                              if ((local_e40[lVar60 + lVar51] != 1.0) ||
                                 (NAN(local_e40[lVar60 + lVar51]))) goto LAB_00614b84;
                              uVar23 = uVar40;
                              if ((local_e48[lVar94 + lVar51] == 1.0) &&
                                 (!NAN(local_e48[lVar94 + lVar51]))) {
                                if ((local_e48[lVar60 + lVar51] == 1.0) &&
                                   (!NAN(local_e48[lVar60 + lVar51]))) {
                                  if ((((((local_e40[lVar94 + local_e58] == 1.0) &&
                                         (!NAN(local_e40[lVar94 + local_e58]))) &&
                                        (local_e40[lVar60 + local_e58] == 1.0)) &&
                                       ((!NAN(local_e40[lVar60 + local_e58]) &&
                                        (local_e48[lVar94 + local_e58] == 1.0)))) &&
                                      (!NAN(local_e48[lVar94 + local_e58]))) &&
                                     ((local_e48[lVar60 + local_e58] == 1.0 &&
                                      (!NAN(local_e48[lVar60 + local_e58]))))) {
                                    lVar94 = (long)(iVar109 + iVar69);
                                    if ((local_e50[lVar94 + lVar103] == 1.0) &&
                                       (!NAN(local_e50[lVar94 + lVar103]))) {
                                      lVar60 = (long)(iVar69 + iVar109 + 1);
                                      if ((local_e50[lVar60 + lVar103] == 1.0) &&
                                         (!NAN(local_e50[lVar60 + lVar103]))) {
                                        if ((local_e88[lVar94 + lVar103] == 1.0) &&
                                           (!NAN(local_e88[lVar94 + lVar103]))) {
                                          if ((local_e88[lVar60 + lVar103] == 1.0) &&
                                             (!NAN(local_e88[lVar60 + lVar103]))) {
                                            uVar23 = 0;
                                            if ((local_e50[lVar94 + local_e60] == 1.0) &&
                                               ((((!NAN(local_e50[lVar94 + local_e60]) &&
                                                  (local_e50[lVar60 + local_e60] == 1.0)) &&
                                                 (!NAN(local_e50[lVar60 + local_e60]))) &&
                                                (((local_e88[lVar94 + local_e60] == 1.0 &&
                                                  (!NAN(local_e88[lVar94 + local_e60]))) &&
                                                 ((local_e88[lVar60 + local_e60] == 1.0 &&
                                                  (!NAN(local_e88[lVar60 + local_e60]))))))))) {
                                              lVar94 = (long)(iVar43 + iVar109);
                                              if ((local_a78[lVar94 + local_e80] == 1.0) &&
                                                 (!NAN(local_a78[lVar94 + local_e80]))) {
                                                lVar60 = (long)(iVar43 + iVar109 + 1);
                                                if ((local_a78[lVar60 + local_e80] == 1.0) &&
                                                   (!NAN(local_a78[lVar60 + local_e80]))) {
                                                  if ((local_a80[lVar94 + local_e80] == 1.0) &&
                                                     (!NAN(local_a80[lVar94 + local_e80]))) {
                                                    if ((((local_a80[lVar60 + local_e80] == 1.0) &&
                                                         (((!NAN(local_a80[lVar60 + local_e80]) &&
                                                           (local_a78[lVar94 + local_e90] == 1.0))
                                                          && (!NAN(local_a78[lVar94 + local_e90]))))
                                                         ) && (((local_a78[lVar60 + local_e90] ==
                                                                 1.0 && (!NAN(local_a78[lVar60 + 
                                                  local_e90]))) &&
                                                  (local_a80[lVar94 + local_e90] == 1.0)))) &&
                                                  (!NAN(local_a80[lVar94 + local_e90]))) {
                                                    uVar23 = -(uint)(local_a80[lVar60 + local_e90]
                                                                    == 1.0) & 1;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            goto LAB_00614bb5;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  uVar23 = 0;
                                }
                              }
                            }
                          }
                        }
LAB_00614bb5:
                        uVar40 = uVar23;
                        if (((iVar81 < local_da4.smallend.vect[2] ||
                             iVar14 < local_da4.smallend.vect[1]) ||
                            (iVar24 < iVar102 || local_da4.bigend.vect[1] < iVar14)) ||
                            local_da4.bigend.vect[2] < iVar81) goto LAB_00614e06;
                        lVar94 = (long)(iVar44 + iVar109);
                        dVar116 = (local_e40[lVar94 + lVar51] + local_e48[lVar94 + lVar51] +
                                   local_e40[lVar94 + local_e58] + local_e48[lVar94 + local_e58]) *
                                  0.25;
                        local_e10[(int)(uVar31 + iVar102)] = dVar116;
                        if ((dVar116 != 0.0) || (NAN(dVar116))) {
                          lVar60 = (long)(iVar109 + iVar110);
                          dVar116 = (1.0 / dVar116) * 0.25;
                          lVar71 = (long)(int)(uVar30 + iVar102);
                          *(double *)(local_1020 + lVar71 * 8) =
                               ((local_7c0[lVar60 + local_7f0] * 0.5 + 0.25) *
                                local_e48[lVar94 + local_e58] +
                               (local_7b8[lVar60 + local_7f0] * 0.5 + -0.25) *
                               local_e40[lVar94 + local_e58] +
                               (local_7b8[lVar60 + local_7e8] * 0.5 + -0.25) *
                               local_e40[lVar94 + lVar51] +
                               (local_7c0[lVar60 + local_7e8] * 0.5 + 0.25) *
                               local_e48[lVar94 + lVar51]) * dVar116;
                          dVar116 = (((local_7c0 + lVar60 + local_7f0)[local_4b0.nstride] * 0.5 +
                                     0.25) * local_e48[lVar94 + local_e58] +
                                    ((local_7b8 + lVar60 + local_7f0)[local_4b0.nstride] * 0.5 +
                                    0.25) * local_e40[lVar94 + local_e58] +
                                    ((local_7b8 + lVar60 + local_7e8)[local_4b0.nstride] * 0.5 +
                                    -0.25) * local_e40[lVar94 + lVar51] +
                                    ((local_7c0 + lVar60 + local_7e8)[local_4b0.nstride] * 0.5 +
                                    -0.25) * local_e48[lVar94 + lVar51]) * dVar116;
                        }
                        else {
                          lVar71 = (long)(int)(uVar30 + iVar102);
                          *(undefined8 *)(local_1020 + lVar71 * 8) = 0;
                          dVar116 = 0.0;
                        }
                        *(double *)(local_6b0 + lVar71 * 8) = dVar116;
LAB_00614f03:
                        if (((iVar81 < local_da4.smallend.vect[2] ||
                             iVar14 < local_da4.smallend.vect[1]) ||
                            (local_da4.bigend.vect[0] < iVar102 || local_f40 < iVar14)) ||
                            local_da4.bigend.vect[2] < iVar81) goto LAB_00615151;
                        iVar41 = iVar109 + iVar69;
                        iVar42 = iVar109 + 1 + iVar69;
                        dVar116 = (local_e50[iVar41 + lVar103] + local_e50[iVar42 + lVar103] +
                                   local_e50[iVar41 + local_e60] + local_e50[iVar42 + local_e60]) *
                                  0.25;
                        local_e08[(int)(uVar33 + iVar102)] = dVar116;
                        if ((dVar116 != 0.0) || (NAN(dVar116))) {
                          iVar84 = iVar109 + 1 + iVar70;
                          dVar116 = (1.0 / dVar116) * 0.25;
                          lVar94 = (long)(int)(uVar32 + iVar102);
                          local_1018[lVar94] =
                               ((local_7b0[iVar84 + local_7d8] * 0.5 + 0.25) *
                                local_e50[iVar42 + local_e60] +
                               (local_7b0[(iVar109 + iVar70) + local_7d8] * 0.5 + -0.25) *
                               local_e50[iVar41 + local_e60] +
                               (local_7b0[(iVar109 + iVar70) + local_7d0] * 0.5 + -0.25) *
                               local_e50[iVar41 + lVar103] +
                               (local_7b0[iVar84 + local_7d0] * 0.5 + 0.25) *
                               local_e50[iVar42 + lVar103]) * dVar116;
                          dVar116 = (((local_7b0 + iVar84 + local_7d8)[local_4f0.nstride] * 0.5 +
                                     0.25) * local_e50[iVar42 + local_e60] +
                                    ((local_7b0 + (iVar109 + iVar70) + local_7d8)[local_4f0.nstride]
                                     * 0.5 + 0.25) * local_e50[iVar41 + local_e60] +
                                    ((local_7b0 + (iVar109 + iVar70) + local_7d0)[local_4f0.nstride]
                                     * 0.5 + -0.25) * local_e50[iVar41 + lVar103] +
                                    ((local_7b0 + iVar84 + local_7d0)[local_4f0.nstride] * 0.5 +
                                    -0.25) * local_e50[iVar42 + lVar103]) * dVar116;
                        }
                        else {
                          lVar94 = (long)(int)(uVar32 + iVar102);
                          local_1018[lVar94] = 0.0;
                          dVar116 = 0.0;
                        }
                        local_6a8[lVar94] = dVar116;
LAB_00615249:
                        if ((((local_da4.bigend.vect[0] < iVar102) ||
                             (iVar14 < local_da4.smallend.vect[1])) ||
                            (local_da4.bigend.vect[1] < iVar14)) ||
                           ((iVar81 < local_da4.smallend.vect[2] || (local_f4c < iVar81))))
                        goto LAB_0061544f;
                        lVar60 = (long)(iVar109 + iVar43);
                        lVar94 = (long)(iVar109 + 1 + iVar43);
                        dVar116 = (local_a78[local_e80 + lVar60] + local_a78[local_e80 + lVar94] +
                                   local_698[lVar60] + local_698[lVar94]) * 0.25;
                        local_e00[(int)(uVar35 + iVar102)] = dVar116;
                        if ((dVar116 != 0.0) || (NAN(dVar116))) {
                          iVar41 = iVar109 + 1 + iVar106;
                          dVar116 = (1.0 / dVar116) * 0.25;
                          lVar71 = (long)(int)(uVar34 + iVar102);
                          local_1010[lVar71] =
                               ((local_7a8[iVar41] * 0.5 + 0.25) * local_698[lVar94] +
                               (local_7a8[iVar109 + iVar106] * 0.5 + -0.25) * local_698[lVar60] +
                               (local_7a0[iVar109 + iVar106] * 0.5 + -0.25) *
                               local_a78[local_e80 + lVar60] +
                               (local_7a0[iVar41] * 0.5 + 0.25) * local_a78[local_e80 + lVar94]) *
                               dVar116;
                          dVar116 = (((local_7a8 + iVar41)[local_530.nstride] * 0.5 + 0.25) *
                                     local_698[lVar94] +
                                    ((local_7a8 + (iVar109 + iVar106))[local_530.nstride] * 0.5 +
                                    0.25) * local_698[lVar60] +
                                    ((local_7a0 + (iVar109 + iVar106))[local_530.nstride] * 0.5 +
                                    -0.25) * local_a78[local_e80 + lVar60] +
                                    ((local_7a0 + iVar41)[local_530.nstride] * 0.5 + -0.25) *
                                    local_a78[local_e80 + lVar94]) * dVar116;
                        }
                        else {
                          lVar71 = (long)(int)(uVar34 + iVar102);
                          local_1010[lVar71] = 0.0;
                          dVar116 = 0.0;
                        }
                        local_6a0[lVar71] = dVar116;
LAB_0061557c:
                        if ((((local_f3c < iVar102) || (iVar14 < local_da4.smallend.vect[1])) ||
                            (iVar67 < iVar14)) ||
                           ((iVar81 < local_da4.smallend.vect[2] || (iVar101 < iVar81))))
                        goto LAB_006156cb;
                        dVar116 = local_690[iVar109 + iVar88];
                        dVar117 = local_690[iVar109 + iVar88 + 1];
                        if ((dVar116 != 1.0) || (NAN(dVar116))) {
LAB_006155fd:
                          if ((dVar116 == -1.0) && (!NAN(dVar116))) {
                            dVar118 = -1.0;
                            if ((dVar117 == -1.0) && (!NAN(dVar117))) goto LAB_006156ac;
                          }
                          dVar116 = (double)(~-(ulong)(dVar116 == -1.0) &
                                            (-(ulong)(dVar116 == 1.0) & 0xbfd0000000000000 |
                                            ~-(ulong)(dVar116 == 1.0) &
                                            (ulong)(dVar116 * 0.5 + -0.25)));
                          dVar117 = (double)(~-(ulong)(dVar117 == -1.0) &
                                            (-(ulong)(dVar117 == 1.0) & 0x3fd0000000000000 |
                                            ~-(ulong)(dVar117 == 1.0) &
                                            (ulong)(dVar117 * 0.5 + 0.25)));
                          dVar118 = (dVar117 * dVar117 - dVar116 * dVar116) /
                                    ((dVar117 - dVar116) + 1e-30);
                          if (dVar118 <= -0.5) {
                            dVar118 = -0.5;
                          }
                          if (0.5 <= dVar118) {
                            dVar118 = 0.5;
                          }
                        }
                        else {
                          dVar118 = 1.0;
                          if ((dVar117 != 1.0) || (NAN(dVar117))) goto LAB_006155fd;
                        }
LAB_006156ac:
                        local_df8[(int)(uVar36 + iVar102)] = dVar118;
LAB_00615772:
                        if ((((iVar24 < iVar102) || (iVar14 < local_da4.smallend.vect[1])) ||
                            (local_f44 < iVar14)) ||
                           ((iVar81 < local_da4.smallend.vect[2] || (iVar101 < iVar81))))
                        goto LAB_006158c1;
                        dVar116 = local_680[iVar109 + iVar97];
                        dVar117 = local_688[iVar109 + iVar97];
                        if ((dVar116 != 1.0) || (NAN(dVar116))) {
LAB_006157f3:
                          if ((dVar116 == -1.0) && (!NAN(dVar116))) {
                            dVar118 = -1.0;
                            if ((dVar117 == -1.0) && (!NAN(dVar117))) goto LAB_006158a2;
                          }
                          dVar118 = (double)(~-(ulong)(dVar116 == -1.0) &
                                            (-(ulong)(dVar116 == 1.0) & 0xbfd0000000000000 |
                                            ~-(ulong)(dVar116 == 1.0) &
                                            (ulong)(dVar116 * 0.5 + -0.25)));
                          dVar116 = (double)(~-(ulong)(dVar117 == -1.0) &
                                            (-(ulong)(dVar117 == 1.0) & 0x3fd0000000000000 |
                                            ~-(ulong)(dVar117 == 1.0) &
                                            (ulong)(dVar117 * 0.5 + 0.25)));
                          dVar118 = (dVar116 * dVar116 - dVar118 * dVar118) /
                                    ((dVar116 - dVar118) + 1e-30);
                          if (dVar118 <= -0.5) {
                            dVar118 = -0.5;
                          }
                          if (0.5 <= dVar118) {
                            dVar118 = 0.5;
                          }
                        }
                        else {
                          dVar118 = 1.0;
                          if ((dVar117 != 1.0) || (NAN(dVar117))) goto LAB_006157f3;
                        }
LAB_006158a2:
                        local_df0[(int)(uVar37 + iVar102)] = dVar118;
LAB_00615964:
                        if ((((iVar24 < iVar102) || (iVar14 < local_da4.smallend.vect[1])) ||
                            (iVar67 < iVar14)) ||
                           ((iVar81 < local_da4.smallend.vect[2] || (local_f48 < iVar81))))
                        goto LAB_006159de;
                        dVar116 = local_678[(iVar109 + iVar90) + local_6b8];
                        dVar117 = local_678[(iVar109 + iVar90) + local_6c0];
                        if ((dVar116 != 1.0) ||
                           (((NAN(dVar116) || (dVar117 != 1.0)) || (NAN(dVar117))))) {
                          if ((((dVar116 != -1.0) || (NAN(dVar116))) || (dVar117 != -1.0)) ||
                             (NAN(dVar117))) {
                            dVar118 = (double)(~-(ulong)(dVar116 == -1.0) &
                                              (-(ulong)(dVar116 == 1.0) & 0xbfd0000000000000 |
                                              ~-(ulong)(dVar116 == 1.0) &
                                              (ulong)(dVar116 * 0.5 + -0.25)));
                            dVar116 = (double)(~-(ulong)(dVar117 == -1.0) &
                                              (-(ulong)(dVar117 == 1.0) & 0x3fd0000000000000 |
                                              ~-(ulong)(dVar117 == 1.0) &
                                              (ulong)(dVar117 * 0.5 + 0.25)));
                            dVar116 = (dVar116 * dVar116 - dVar118 * dVar118) /
                                      ((dVar116 - dVar118) + 1e-30);
                            if (dVar116 <= -0.5) {
                              dVar116 = -0.5;
                            }
                            if (0.5 <= dVar116) {
                              dVar116 = 0.5;
                            }
                          }
                          else {
                            dVar116 = -1.0;
                          }
                        }
                        else {
                          dVar116 = 1.0;
                        }
LAB_00615aef:
                        local_658[-local_f0.begin.x + iVar102] = dVar116;
                      }
                      if (uVar23 < uVar15) {
                        uVar23 = uVar15;
                      }
                      uVar104 = (ulong)(iVar102 + 1U);
                      iVar43 = iVar43 + 2;
                      iVar69 = iVar69 + 2;
                      iVar44 = iVar44 + 2;
                      iVar45 = iVar45 + 2;
                      iVar46 = iVar46 + 2;
                      iVar47 = iVar47 + 2;
                      iVar48 = iVar48 + 2;
                      iVar49 = iVar49 + 2;
                      iVar50 = iVar50 + 2;
                      iVar110 = iVar110 + 2;
                      iVar70 = iVar70 + 2;
                      iVar106 = iVar106 + 2;
                      iVar88 = iVar88 + 2;
                      iVar97 = iVar97 + 2;
                      iVar90 = iVar90 + 2;
                      uVar15 = uVar23;
                    } while (local_64c.bigend.vect[0] + 1U != iVar102 + 1U);
                  }
                  bVar20 = iVar14 != local_64c.bigend.vect[1];
                  iVar14 = iVar14 + 1;
                } while (bVar20);
              }
              bVar20 = iVar81 != local_64c.bigend.vect[2];
              iVar81 = iVar81 + 1;
            } while (bVar20);
          }
          uVar65 = local_1008;
          if ((int)local_1008 <= (int)uVar23) {
            uVar65 = uVar23;
          }
          MFIter::operator++((MFIter *)local_10e8);
        } while ((int)local_10e8._32_4_ < (int)local_10e8._40_4_);
        bVar20 = uVar65 != 0;
      }
      MFIter::~MFIter((MFIter *)local_10e8);
      local_10e8[0] = bVar20;
      ParallelDescriptor::ReduceBoolOr((bool *)local_10e8);
      iVar83 = 1;
      if ((bool)local_10e8[0] == false) {
        buildCellFlag(this);
        iVar83 = 0;
      }
    }
  }
  return iVar83;
}

Assistant:

int
Level::coarsenFromFine (Level& fineLevel, bool fill_boundary)
{
    const BoxArray& fine_grids = fineLevel.m_grids;
    const BoxArray& fine_covered_grids = fineLevel.m_covered_grids;
    const DistributionMapping& fine_dmap = fineLevel.m_dmap;
    m_grids = amrex::coarsen(fine_grids,2);
    m_covered_grids = amrex::coarsen(fine_covered_grids, 2);
    m_dmap = fine_dmap;

    if (! (fine_grids.coarsenable(2,2) &&
           (fine_covered_grids.empty() || fine_covered_grids.coarsenable(2,2)))) {
        return 1;
    }

    auto const& f_levelset = fineLevel.m_levelset;
    m_levelset.define(amrex::convert(m_grids,IntVect::TheNodeVector()), m_dmap, 1, 0);
    int mvmc_error = 0;

    if (Gpu::notInLaunchRegion())
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mvmc_error)
#endif
        for (MFIter mfi(m_levelset,true); mfi.isValid(); ++mfi)
        {
            const Box& ccbx = mfi.tilebox(IntVect::TheCellVector());
            const Box& ndbx = mfi.tilebox();
            auto const& crse = m_levelset.array(mfi);
            auto const& fine = f_levelset.const_array(mfi);

            amrex::LoopConcurrentOnCpu(ndbx,
            [=] (int i, int j, int k) noexcept
            {
                crse(i,j,k) = fine(2*i,2*j,2*k);
            });

            int tile_error = 0;
            amrex::LoopOnCpu(ccbx,
            [=,&tile_error] (int i, int j, int k) noexcept
            {
                int ierror = check_mvmc(i,j,k,fine);
                tile_error = std::max(tile_error,ierror);
            });

            mvmc_error = std::max(mvmc_error, tile_error);
        }
    }
    else
    {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(m_levelset); mfi.isValid(); ++mfi)
        {
            const Box& ndbx = mfi.validbox();
            const Box& ccbx = amrex::enclosedCells(ndbx);
            auto const& crse = m_levelset.array(mfi);
            auto const& fine = f_levelset.const_array(mfi);
            reduce_op.eval(ndbx, reduce_data,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
            {
                crse(i,j,k) = fine(2*i,2*j,2*k);
                int ierror;
                if (ccbx.contains(IntVect{AMREX_D_DECL(i,j,k)})) {
                    ierror = check_mvmc(i,j,k,fine);
                } else {
                    ierror = 0;
                }
                return {ierror};
            });
        }
        ReduceTuple rv = reduce_data.value(reduce_op);
        mvmc_error = amrex::max(0, amrex::get<0>(rv));
    }

    {
        bool b = mvmc_error;
        ParallelDescriptor::ReduceBoolOr(b);
        mvmc_error = b;
    }
    if (mvmc_error) return mvmc_error;

    const int ng = 2;
    m_cellflag.define(m_grids, m_dmap, 1, ng);
    m_volfrac.define(m_grids, m_dmap, 1, ng);
    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    m_bndryarea.define(m_grids, m_dmap, 1, ng);
    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng);
    }

    auto& f_cellflag = fineLevel.m_cellflag;
    MultiFab& f_volfrac = fineLevel.m_volfrac;
    MultiFab& f_centroid = fineLevel.m_centroid;
    MultiFab& f_bndryarea = fineLevel.m_bndryarea;
    MultiFab& f_bndrycent = fineLevel.m_bndrycent;
    MultiFab& f_bndrynorm = fineLevel.m_bndrynorm;
    auto& f_areafrac = fineLevel.m_areafrac;
    auto& f_facecent = fineLevel.m_facecent;
    auto& f_edgecent = fineLevel.m_edgecent;

    if (fill_boundary)
    {
        const Geometry& fine_geom = fineLevel.m_geom;
        const auto& fine_period = fine_geom.periodicity();
        f_cellflag.FillBoundary(fine_period);
        f_volfrac.FillBoundary(fine_period);
        f_centroid.FillBoundary(fine_period);
        f_bndryarea.FillBoundary(fine_period);
        f_bndrycent.FillBoundary(fine_period);
        f_bndrynorm.FillBoundary(fine_period);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            f_areafrac[idim].FillBoundary(fine_period);
            f_facecent[idim].FillBoundary(fine_period);
            f_edgecent[idim].FillBoundary(fine_period);
        }

        if (!fine_covered_grids.empty())
        {
            const std::vector<IntVect>& pshifts = fine_period.shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            {
                std::vector<std::pair<int,Box> > isects;
                for (MFIter mfi(f_volfrac); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.fabbox();
                    auto const& vfrac = f_volfrac.array(mfi);
                    auto const& cflag = f_cellflag.array(mfi);
                    AMREX_D_TERM(auto const& apx = f_areafrac[0].array(mfi);,
                                 auto const& apy = f_areafrac[1].array(mfi);,
                                 auto const& apz = f_areafrac[2].array(mfi););

                    for (const auto& iv : pshifts)
                    {
                        fine_covered_grids.intersections(bx+iv, isects);
                        for (const auto& is : isects)
                        {
                            Box const& ibox = is.second - iv;
                            Box const& indbox = amrex::surroundingNodes(ibox);
                            AMREX_D_TERM(auto const& xbx = amrex::surroundingNodes(ibox,0);,
                                         auto const& ybx = amrex::surroundingNodes(ibox,1);,
                                         auto const& zbx = amrex::surroundingNodes(ibox,2););
                            AMREX_HOST_DEVICE_FOR_3D(indbox, i,j,k,
                            {
                                IntVect cell(AMREX_D_DECL(i,j,k));
                                if (ibox.contains(cell)) {
                                    vfrac(i,j,k) = 0.0;
                                    cflag(i,j,k) = EBCellFlag::TheCoveredCell();
                                }
                                AMREX_D_TERM(if (xbx.contains(cell)) apx(i,j,k) = 0.0;,
                                             if (ybx.contains(cell)) apy(i,j,k) = 0.0;,
                                             if (zbx.contains(cell)) apz(i,j,k) = 0.0;);
                            });
                        }
                    }
                }
            }
        }
    }

    int error = 0;

    if (Gpu::notInLaunchRegion())
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:error)
#endif
        for (MFIter mfi(m_volfrac,true); mfi.isValid(); ++mfi)
        {
            auto const& cvol = m_volfrac.array(mfi);
            auto const& ccent = m_centroid.array(mfi);
            auto const& cba = m_bndryarea.array(mfi);
            auto const& cbc = m_bndrycent.array(mfi);
            auto const& cbn = m_bndrynorm.array(mfi);
            AMREX_D_TERM(auto const& capx = m_areafrac[0].array(mfi);,
                         auto const& capy = m_areafrac[1].array(mfi);,
                         auto const& capz = m_areafrac[2].array(mfi););
            AMREX_D_TERM(auto const& cfcx = m_facecent[0].array(mfi);,
                         auto const& cfcy = m_facecent[1].array(mfi);,
                         auto const& cfcz = m_facecent[2].array(mfi););
            AMREX_D_TERM(auto const& cecx = m_edgecent[0].array(mfi);,
                         auto const& cecy = m_edgecent[1].array(mfi);,
                         auto const& cecz = m_edgecent[2].array(mfi););
            auto const& cflag = m_cellflag.array(mfi);

            auto const& fvol = f_volfrac.const_array(mfi);
            auto const& fcent = f_centroid.const_array(mfi);
            auto const& fba = f_bndryarea.const_array(mfi);
            auto const& fbc = f_bndrycent.const_array(mfi);
            auto const& fbn = f_bndrynorm.const_array(mfi);
            AMREX_D_TERM(auto const& fapx = f_areafrac[0].const_array(mfi);,
                         auto const& fapy = f_areafrac[1].const_array(mfi);,
                         auto const& fapz = f_areafrac[2].const_array(mfi););
            AMREX_D_TERM(auto const& ffcx = f_facecent[0].const_array(mfi);,
                         auto const& ffcy = f_facecent[1].const_array(mfi);,
                         auto const& ffcz = f_facecent[2].const_array(mfi););
            AMREX_D_TERM(auto const& fecx = f_edgecent[0].const_array(mfi);,
                         auto const& fecy = f_edgecent[1].const_array(mfi);,
                         auto const& fecz = f_edgecent[2].const_array(mfi););
            auto const& fflag = f_cellflag.const_array(mfi);

            Box const& bx = mfi.validbox();
            Box const& ndgbx = mfi.grownnodaltilebox(-1,2);

            int tile_error = 0;
            amrex::LoopOnCpu(ndgbx,
            [=,&tile_error] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                int ierr = coarsen_from_fine(AMREX_D_DECL(i,j,k), bx, 2,
                                             cvol,ccent,cba,cbc,cbn,
                                             AMREX_D_DECL(capx,capy,capz),
                                             AMREX_D_DECL(cfcx,cfcy,cfcz),
                                             AMREX_D_DECL(cecx,cecy,cecz),
                                             cflag,fvol,fcent,fba,fbc,fbn,
                                             AMREX_D_DECL(fapx,fapy,fapz),
                                             AMREX_D_DECL(ffcx,ffcy,ffcz),
                                             AMREX_D_DECL(fecx,fecy,fecz),
                                             fflag);
                tile_error = std::max(tile_error,ierr);
            });

            error = std::max(error,tile_error);
        }
    }
    else
    {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(m_volfrac); mfi.isValid(); ++mfi)
        {
            auto const& cvol = m_volfrac.array(mfi);
            auto const& ccent = m_centroid.array(mfi);
            auto const& cba = m_bndryarea.array(mfi);
            auto const& cbc = m_bndrycent.array(mfi);
            auto const& cbn = m_bndrynorm.array(mfi);
            AMREX_D_TERM(auto const& capx = m_areafrac[0].array(mfi);,
                         auto const& capy = m_areafrac[1].array(mfi);,
                         auto const& capz = m_areafrac[2].array(mfi););
            AMREX_D_TERM(auto const& cfcx = m_facecent[0].array(mfi);,
                         auto const& cfcy = m_facecent[1].array(mfi);,
                         auto const& cfcz = m_facecent[2].array(mfi););
            AMREX_D_TERM(auto const& cecx = m_edgecent[0].array(mfi);,
                         auto const& cecy = m_edgecent[1].array(mfi);,
                         auto const& cecz = m_edgecent[2].array(mfi););
            auto const& cflag = m_cellflag.array(mfi);

            auto const& fvol = f_volfrac.const_array(mfi);
            auto const& fcent = f_centroid.const_array(mfi);
            auto const& fba = f_bndryarea.const_array(mfi);
            auto const& fbc = f_bndrycent.const_array(mfi);
            auto const& fbn = f_bndrynorm.const_array(mfi);
            AMREX_D_TERM(auto const& fapx = f_areafrac[0].const_array(mfi);,
                         auto const& fapy = f_areafrac[1].const_array(mfi);,
                         auto const& fapz = f_areafrac[2].const_array(mfi););
            AMREX_D_TERM(auto const& ffcx = f_facecent[0].const_array(mfi);,
                         auto const& ffcy = f_facecent[1].const_array(mfi);,
                         auto const& ffcz = f_facecent[2].const_array(mfi););
            AMREX_D_TERM(auto const& fecx = f_edgecent[0].const_array(mfi);,
                         auto const& fecy = f_edgecent[1].const_array(mfi);,
                         auto const& fecz = f_edgecent[2].const_array(mfi););
            auto const& fflag = f_cellflag.const_array(mfi);

            Box const& bx = mfi.validbox();
            Box const& gbx = amrex::grow(bx,2);
            Box const& ndgbx = amrex::surroundingNodes(gbx);

            reduce_op.eval(ndgbx, reduce_data,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
            {
                amrex::ignore_unused(j,k);
                int ierr = coarsen_from_fine(AMREX_D_DECL(i,j,k), bx, 2,
                                             cvol,ccent,cba,cbc,cbn,
                                             AMREX_D_DECL(capx,capy,capz),
                                             AMREX_D_DECL(cfcx,cfcy,cfcz),
                                             AMREX_D_DECL(cecx,cecy,cecz),
                                             cflag,fvol,fcent,fba,fbc,fbn,
                                             AMREX_D_DECL(fapx,fapy,fapz),
                                             AMREX_D_DECL(ffcx,ffcy,ffcz),
                                             AMREX_D_DECL(fecx,fecy,fecz),
                                             fflag);
                return {ierr};
            });
        }

        ReduceTuple rv = reduce_data.value(reduce_op);
        error = amrex::max(0, amrex::get<0>(rv));
    }

    {
        bool b = error;
        ParallelDescriptor::ReduceBoolOr(b);
        error = b;
    }

    if (!error) {
        buildCellFlag();
    }

    return error;
}